

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O3

bool embree::sse2::CurveNiMBIntersectorK<4,4>::
     occluded_hn<embree::sse2::OrientedCurve1IntersectorK<embree::HermiteCurveT,4>,embree::sse2::Occluded1KEpilog1<4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  Primitive *pPVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  Primitive PVar13;
  undefined4 uVar14;
  Geometry *pGVar15;
  __int_type_conflict _Var16;
  long lVar17;
  long lVar18;
  __int_type_conflict _Var19;
  long lVar20;
  long lVar21;
  undefined1 auVar22 [12];
  undefined1 auVar23 [12];
  undefined1 auVar24 [12];
  undefined1 auVar25 [12];
  undefined1 auVar26 [12];
  undefined1 auVar27 [12];
  undefined1 auVar28 [12];
  undefined8 uVar29;
  undefined6 uVar30;
  undefined1 auVar31 [12];
  undefined1 auVar32 [12];
  undefined1 auVar33 [12];
  undefined1 auVar34 [12];
  undefined1 auVar35 [12];
  undefined1 auVar36 [12];
  undefined1 auVar37 [12];
  undefined1 auVar38 [12];
  undefined1 auVar39 [12];
  undefined1 auVar40 [12];
  undefined1 auVar41 [12];
  undefined1 auVar42 [12];
  undefined1 auVar43 [12];
  undefined1 auVar44 [12];
  undefined1 auVar45 [12];
  undefined1 auVar46 [12];
  undefined1 auVar47 [12];
  undefined1 auVar48 [12];
  undefined1 auVar49 [12];
  undefined1 auVar50 [12];
  undefined1 auVar51 [12];
  byte bVar52;
  int iVar53;
  ulong uVar54;
  ulong uVar55;
  long lVar57;
  RTCFilterFunctionN p_Var58;
  RTCRayN *pRVar59;
  bool bVar60;
  long lVar61;
  ulong uVar62;
  bool bVar63;
  uint uVar64;
  uint uVar65;
  int iVar66;
  uint uVar67;
  uint uVar68;
  short sVar69;
  undefined2 uVar104;
  float fVar70;
  float fVar105;
  float fVar106;
  vfloat_impl<4> p00;
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar74 [16];
  undefined1 auVar77 [16];
  undefined1 auVar80 [16];
  undefined1 auVar83 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  float fVar107;
  float fVar133;
  float fVar134;
  undefined1 auVar108 [16];
  undefined1 auVar111 [16];
  undefined1 auVar114 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  float fVar135;
  float fVar146;
  float fVar147;
  vfloat4 v;
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  float fVar148;
  float fVar156;
  float fVar157;
  vfloat4 v_1;
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  float fVar158;
  float fVar169;
  float fVar170;
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  float fVar171;
  float fVar197;
  float fVar198;
  undefined1 auVar172 [16];
  undefined1 auVar175 [16];
  undefined1 auVar178 [16];
  undefined1 auVar181 [16];
  undefined1 auVar184 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  float fVar199;
  float fVar202;
  float fVar203;
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  float fVar204;
  float fVar217;
  float fVar218;
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  float fVar219;
  float fVar220;
  float fVar229;
  float fVar230;
  float fVar231;
  float fVar232;
  float fVar233;
  float fVar234;
  float fVar235;
  float fVar236;
  float fVar237;
  float fVar238;
  float fVar239;
  float fVar240;
  float fVar241;
  float fVar242;
  float fVar243;
  float fVar244;
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  float fVar245;
  float fVar260;
  float fVar263;
  undefined1 auVar248 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  float fVar246;
  float fVar247;
  float fVar261;
  float fVar262;
  float fVar264;
  float fVar265;
  float fVar266;
  float fVar267;
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  float fVar268;
  float fVar281;
  float fVar284;
  vfloat4 a;
  undefined1 auVar271 [16];
  undefined1 auVar274 [16];
  float fVar269;
  float fVar270;
  float fVar282;
  float fVar283;
  float fVar285;
  float fVar286;
  float fVar287;
  float fVar288;
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  float fVar289;
  float fVar302;
  float fVar305;
  vfloat4 a_2;
  float fVar308;
  undefined1 auVar292 [16];
  float fVar290;
  float fVar291;
  undefined1 auVar293 [16];
  undefined1 auVar296 [16];
  float fVar303;
  float fVar304;
  float fVar306;
  float fVar307;
  float fVar309;
  float fVar310;
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  float fVar311;
  float fVar312;
  float fVar322;
  float fVar324;
  float fVar326;
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar317 [16];
  float fVar323;
  float fVar325;
  float fVar327;
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  float fVar328;
  float fVar329;
  float fVar330;
  float fVar333;
  float fVar334;
  float fVar335;
  float fVar336;
  float fVar337;
  float fVar338;
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  undefined1 auVar339 [16];
  undefined1 auVar340 [16];
  undefined1 auVar341 [16];
  undefined1 auVar342 [16];
  vfloat_impl<4> p03;
  vfloat_impl<4> p01;
  vfloat_impl<4> p00_1;
  vfloat_impl<4> p02;
  uint mask_stack [4];
  RTCFilterFunctionNArguments args;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  undefined1 local_528 [8];
  float fStack_520;
  float fStack_51c;
  undefined1 local_518 [8];
  float fStack_510;
  float fStack_50c;
  float fStack_3c0;
  float fStack_3bc;
  undefined1 local_3a8 [16];
  undefined1 (*local_390) [16];
  Primitive *local_388;
  ulong local_380;
  float local_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  undefined1 local_368 [16];
  float local_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  undefined1 local_348 [16];
  undefined8 local_338;
  float fStack_330;
  float fStack_32c;
  float afStack_328 [4];
  RTCFilterFunctionNArguments local_318;
  uint local_2e8;
  uint uStack_2e4;
  uint uStack_2e0;
  uint uStack_2dc;
  uint local_2d8;
  uint uStack_2d4;
  uint uStack_2d0;
  uint uStack_2cc;
  float local_2c8;
  float fStack_2c4;
  float fStack_2c0;
  float fStack_2bc;
  float local_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float local_2a8;
  float fStack_2a4;
  float fStack_2a0;
  float fStack_29c;
  float local_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float local_288;
  float fStack_284;
  float fStack_280;
  float fStack_27c;
  float local_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  undefined1 local_268 [16];
  float local_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float local_248;
  float fStack_244;
  float fStack_240;
  float fStack_23c;
  float local_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float local_228;
  float fStack_224;
  float fStack_220;
  float fStack_21c;
  undefined1 local_218 [16];
  undefined1 local_208 [16];
  float local_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [16];
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float afStack_108 [8];
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  uint local_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint local_68;
  uint uStack_64;
  uint uStack_60;
  uint uStack_5c;
  float afStack_58 [10];
  ulong uVar56;
  undefined1 auVar100 [16];
  undefined1 auVar73 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 uVar103;
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  
  PVar13 = prim[1];
  uVar54 = (ulong)(byte)PVar13;
  lVar57 = uVar54 * 0x25;
  pPVar4 = prim + lVar57 + 6;
  fVar147 = *(float *)(pPVar4 + 0xc);
  fVar148 = (*(float *)(ray + k * 4) - *(float *)pPVar4) * fVar147;
  fVar156 = (*(float *)(ray + k * 4 + 0x10) - *(float *)(pPVar4 + 4)) * fVar147;
  fVar157 = (*(float *)(ray + k * 4 + 0x20) - *(float *)(pPVar4 + 8)) * fVar147;
  fVar135 = *(float *)(ray + k * 4 + 0x40) * fVar147;
  fVar146 = *(float *)(ray + k * 4 + 0x50) * fVar147;
  fVar147 = *(float *)(ray + k * 4 + 0x60) * fVar147;
  uVar14 = *(undefined4 *)(prim + uVar54 * 4 + 6);
  uVar103 = (undefined1)((uint)uVar14 >> 0x18);
  uVar104 = CONCAT11(uVar103,uVar103);
  uVar103 = (undefined1)((uint)uVar14 >> 0x10);
  uVar29 = CONCAT35(CONCAT21(uVar104,uVar103),CONCAT14(uVar103,uVar14));
  uVar103 = (undefined1)((uint)uVar14 >> 8);
  uVar30 = CONCAT51(CONCAT41((int)((ulong)uVar29 >> 0x20),uVar103),uVar103);
  sVar69 = CONCAT11((char)uVar14,(char)uVar14);
  uVar56 = CONCAT62(uVar30,sVar69);
  auVar252._8_4_ = 0;
  auVar252._0_8_ = uVar56;
  auVar252._12_2_ = uVar104;
  auVar252._14_2_ = uVar104;
  uVar104 = (undefined2)((ulong)uVar29 >> 0x20);
  auVar137._12_4_ = auVar252._12_4_;
  auVar137._8_2_ = 0;
  auVar137._0_8_ = uVar56;
  auVar137._10_2_ = uVar104;
  auVar71._10_6_ = auVar137._10_6_;
  auVar71._8_2_ = uVar104;
  auVar71._0_8_ = uVar56;
  uVar104 = (undefined2)uVar30;
  auVar31._4_8_ = auVar71._8_8_;
  auVar31._2_2_ = uVar104;
  auVar31._0_2_ = uVar104;
  fVar328 = (float)((int)sVar69 >> 8);
  fVar333 = (float)(auVar31._0_4_ >> 0x18);
  fVar335 = (float)(auVar71._8_4_ >> 0x18);
  uVar14 = *(undefined4 *)(prim + uVar54 * 5 + 6);
  uVar103 = (undefined1)((uint)uVar14 >> 0x18);
  uVar104 = CONCAT11(uVar103,uVar103);
  uVar103 = (undefined1)((uint)uVar14 >> 0x10);
  uVar29 = CONCAT35(CONCAT21(uVar104,uVar103),CONCAT14(uVar103,uVar14));
  uVar103 = (undefined1)((uint)uVar14 >> 8);
  uVar30 = CONCAT51(CONCAT41((int)((ulong)uVar29 >> 0x20),uVar103),uVar103);
  sVar69 = CONCAT11((char)uVar14,(char)uVar14);
  uVar56 = CONCAT62(uVar30,sVar69);
  auVar110._8_4_ = 0;
  auVar110._0_8_ = uVar56;
  auVar110._12_2_ = uVar104;
  auVar110._14_2_ = uVar104;
  uVar104 = (undefined2)((ulong)uVar29 >> 0x20);
  auVar109._12_4_ = auVar110._12_4_;
  auVar109._8_2_ = 0;
  auVar109._0_8_ = uVar56;
  auVar109._10_2_ = uVar104;
  auVar108._10_6_ = auVar109._10_6_;
  auVar108._8_2_ = uVar104;
  auVar108._0_8_ = uVar56;
  uVar104 = (undefined2)uVar30;
  auVar32._4_8_ = auVar108._8_8_;
  auVar32._2_2_ = uVar104;
  auVar32._0_2_ = uVar104;
  fVar158 = (float)((int)sVar69 >> 8);
  fVar169 = (float)(auVar32._0_4_ >> 0x18);
  fVar170 = (float)(auVar108._8_4_ >> 0x18);
  uVar14 = *(undefined4 *)(prim + uVar54 * 6 + 6);
  uVar103 = (undefined1)((uint)uVar14 >> 0x18);
  uVar104 = CONCAT11(uVar103,uVar103);
  uVar103 = (undefined1)((uint)uVar14 >> 0x10);
  uVar29 = CONCAT35(CONCAT21(uVar104,uVar103),CONCAT14(uVar103,uVar14));
  uVar103 = (undefined1)((uint)uVar14 >> 8);
  uVar30 = CONCAT51(CONCAT41((int)((ulong)uVar29 >> 0x20),uVar103),uVar103);
  sVar69 = CONCAT11((char)uVar14,(char)uVar14);
  uVar56 = CONCAT62(uVar30,sVar69);
  auVar113._8_4_ = 0;
  auVar113._0_8_ = uVar56;
  auVar113._12_2_ = uVar104;
  auVar113._14_2_ = uVar104;
  uVar104 = (undefined2)((ulong)uVar29 >> 0x20);
  auVar112._12_4_ = auVar113._12_4_;
  auVar112._8_2_ = 0;
  auVar112._0_8_ = uVar56;
  auVar112._10_2_ = uVar104;
  auVar111._10_6_ = auVar112._10_6_;
  auVar111._8_2_ = uVar104;
  auVar111._0_8_ = uVar56;
  uVar104 = (undefined2)uVar30;
  auVar33._4_8_ = auVar111._8_8_;
  auVar33._2_2_ = uVar104;
  auVar33._0_2_ = uVar104;
  fVar199 = (float)((int)sVar69 >> 8);
  fVar202 = (float)(auVar33._0_4_ >> 0x18);
  fVar203 = (float)(auVar111._8_4_ >> 0x18);
  uVar14 = *(undefined4 *)(prim + uVar54 * 0xf + 6);
  uVar103 = (undefined1)((uint)uVar14 >> 0x18);
  uVar104 = CONCAT11(uVar103,uVar103);
  uVar103 = (undefined1)((uint)uVar14 >> 0x10);
  uVar29 = CONCAT35(CONCAT21(uVar104,uVar103),CONCAT14(uVar103,uVar14));
  uVar103 = (undefined1)((uint)uVar14 >> 8);
  uVar30 = CONCAT51(CONCAT41((int)((ulong)uVar29 >> 0x20),uVar103),uVar103);
  sVar69 = CONCAT11((char)uVar14,(char)uVar14);
  uVar56 = CONCAT62(uVar30,sVar69);
  auVar116._8_4_ = 0;
  auVar116._0_8_ = uVar56;
  auVar116._12_2_ = uVar104;
  auVar116._14_2_ = uVar104;
  uVar104 = (undefined2)((ulong)uVar29 >> 0x20);
  auVar115._12_4_ = auVar116._12_4_;
  auVar115._8_2_ = 0;
  auVar115._0_8_ = uVar56;
  auVar115._10_2_ = uVar104;
  auVar114._10_6_ = auVar115._10_6_;
  auVar114._8_2_ = uVar104;
  auVar114._0_8_ = uVar56;
  uVar104 = (undefined2)uVar30;
  auVar34._4_8_ = auVar114._8_8_;
  auVar34._2_2_ = uVar104;
  auVar34._0_2_ = uVar104;
  fVar70 = (float)((int)sVar69 >> 8);
  fVar105 = (float)(auVar34._0_4_ >> 0x18);
  fVar106 = (float)(auVar114._8_4_ >> 0x18);
  uVar14 = *(undefined4 *)(prim + (ulong)(byte)PVar13 * 0x10 + 6);
  uVar103 = (undefined1)((uint)uVar14 >> 0x18);
  uVar104 = CONCAT11(uVar103,uVar103);
  uVar103 = (undefined1)((uint)uVar14 >> 0x10);
  uVar29 = CONCAT35(CONCAT21(uVar104,uVar103),CONCAT14(uVar103,uVar14));
  uVar103 = (undefined1)((uint)uVar14 >> 8);
  uVar30 = CONCAT51(CONCAT41((int)((ulong)uVar29 >> 0x20),uVar103),uVar103);
  sVar69 = CONCAT11((char)uVar14,(char)uVar14);
  uVar56 = CONCAT62(uVar30,sVar69);
  auVar174._8_4_ = 0;
  auVar174._0_8_ = uVar56;
  auVar174._12_2_ = uVar104;
  auVar174._14_2_ = uVar104;
  uVar104 = (undefined2)((ulong)uVar29 >> 0x20);
  auVar173._12_4_ = auVar174._12_4_;
  auVar173._8_2_ = 0;
  auVar173._0_8_ = uVar56;
  auVar173._10_2_ = uVar104;
  auVar172._10_6_ = auVar173._10_6_;
  auVar172._8_2_ = uVar104;
  auVar172._0_8_ = uVar56;
  uVar104 = (undefined2)uVar30;
  auVar35._4_8_ = auVar172._8_8_;
  auVar35._2_2_ = uVar104;
  auVar35._0_2_ = uVar104;
  fVar204 = (float)((int)sVar69 >> 8);
  fVar217 = (float)(auVar35._0_4_ >> 0x18);
  fVar218 = (float)(auVar172._8_4_ >> 0x18);
  uVar14 = *(undefined4 *)(prim + (ulong)(byte)PVar13 * 0x10 + uVar54 + 6);
  uVar103 = (undefined1)((uint)uVar14 >> 0x18);
  uVar104 = CONCAT11(uVar103,uVar103);
  uVar103 = (undefined1)((uint)uVar14 >> 0x10);
  uVar29 = CONCAT35(CONCAT21(uVar104,uVar103),CONCAT14(uVar103,uVar14));
  uVar103 = (undefined1)((uint)uVar14 >> 8);
  uVar30 = CONCAT51(CONCAT41((int)((ulong)uVar29 >> 0x20),uVar103),uVar103);
  sVar69 = CONCAT11((char)uVar14,(char)uVar14);
  uVar56 = CONCAT62(uVar30,sVar69);
  auVar177._8_4_ = 0;
  auVar177._0_8_ = uVar56;
  auVar177._12_2_ = uVar104;
  auVar177._14_2_ = uVar104;
  uVar104 = (undefined2)((ulong)uVar29 >> 0x20);
  auVar176._12_4_ = auVar177._12_4_;
  auVar176._8_2_ = 0;
  auVar176._0_8_ = uVar56;
  auVar176._10_2_ = uVar104;
  auVar175._10_6_ = auVar176._10_6_;
  auVar175._8_2_ = uVar104;
  auVar175._0_8_ = uVar56;
  uVar104 = (undefined2)uVar30;
  auVar36._4_8_ = auVar175._8_8_;
  auVar36._2_2_ = uVar104;
  auVar36._0_2_ = uVar104;
  fVar245 = (float)((int)sVar69 >> 8);
  fVar260 = (float)(auVar36._0_4_ >> 0x18);
  fVar263 = (float)(auVar175._8_4_ >> 0x18);
  uVar14 = *(undefined4 *)(prim + uVar54 * 0x1a + 6);
  uVar103 = (undefined1)((uint)uVar14 >> 0x18);
  uVar104 = CONCAT11(uVar103,uVar103);
  uVar103 = (undefined1)((uint)uVar14 >> 0x10);
  uVar29 = CONCAT35(CONCAT21(uVar104,uVar103),CONCAT14(uVar103,uVar14));
  uVar103 = (undefined1)((uint)uVar14 >> 8);
  uVar30 = CONCAT51(CONCAT41((int)((ulong)uVar29 >> 0x20),uVar103),uVar103);
  sVar69 = CONCAT11((char)uVar14,(char)uVar14);
  uVar56 = CONCAT62(uVar30,sVar69);
  auVar180._8_4_ = 0;
  auVar180._0_8_ = uVar56;
  auVar180._12_2_ = uVar104;
  auVar180._14_2_ = uVar104;
  uVar104 = (undefined2)((ulong)uVar29 >> 0x20);
  auVar179._12_4_ = auVar180._12_4_;
  auVar179._8_2_ = 0;
  auVar179._0_8_ = uVar56;
  auVar179._10_2_ = uVar104;
  auVar178._10_6_ = auVar179._10_6_;
  auVar178._8_2_ = uVar104;
  auVar178._0_8_ = uVar56;
  uVar104 = (undefined2)uVar30;
  auVar37._4_8_ = auVar178._8_8_;
  auVar37._2_2_ = uVar104;
  auVar37._0_2_ = uVar104;
  fVar219 = (float)((int)sVar69 >> 8);
  fVar229 = (float)(auVar37._0_4_ >> 0x18);
  fVar234 = (float)(auVar178._8_4_ >> 0x18);
  uVar14 = *(undefined4 *)(prim + uVar54 * 0x1b + 6);
  uVar103 = (undefined1)((uint)uVar14 >> 0x18);
  uVar104 = CONCAT11(uVar103,uVar103);
  uVar103 = (undefined1)((uint)uVar14 >> 0x10);
  uVar29 = CONCAT35(CONCAT21(uVar104,uVar103),CONCAT14(uVar103,uVar14));
  uVar103 = (undefined1)((uint)uVar14 >> 8);
  uVar30 = CONCAT51(CONCAT41((int)((ulong)uVar29 >> 0x20),uVar103),uVar103);
  sVar69 = CONCAT11((char)uVar14,(char)uVar14);
  uVar56 = CONCAT62(uVar30,sVar69);
  auVar183._8_4_ = 0;
  auVar183._0_8_ = uVar56;
  auVar183._12_2_ = uVar104;
  auVar183._14_2_ = uVar104;
  uVar104 = (undefined2)((ulong)uVar29 >> 0x20);
  auVar182._12_4_ = auVar183._12_4_;
  auVar182._8_2_ = 0;
  auVar182._0_8_ = uVar56;
  auVar182._10_2_ = uVar104;
  auVar181._10_6_ = auVar182._10_6_;
  auVar181._8_2_ = uVar104;
  auVar181._0_8_ = uVar56;
  uVar104 = (undefined2)uVar30;
  auVar38._4_8_ = auVar181._8_8_;
  auVar38._2_2_ = uVar104;
  auVar38._0_2_ = uVar104;
  fVar268 = (float)((int)sVar69 >> 8);
  fVar281 = (float)(auVar38._0_4_ >> 0x18);
  fVar284 = (float)(auVar181._8_4_ >> 0x18);
  uVar14 = *(undefined4 *)(prim + uVar54 * 0x1c + 6);
  uVar103 = (undefined1)((uint)uVar14 >> 0x18);
  uVar104 = CONCAT11(uVar103,uVar103);
  uVar103 = (undefined1)((uint)uVar14 >> 0x10);
  uVar29 = CONCAT35(CONCAT21(uVar104,uVar103),CONCAT14(uVar103,uVar14));
  uVar103 = (undefined1)((uint)uVar14 >> 8);
  uVar30 = CONCAT51(CONCAT41((int)((ulong)uVar29 >> 0x20),uVar103),uVar103);
  sVar69 = CONCAT11((char)uVar14,(char)uVar14);
  uVar56 = CONCAT62(uVar30,sVar69);
  auVar186._8_4_ = 0;
  auVar186._0_8_ = uVar56;
  auVar186._12_2_ = uVar104;
  auVar186._14_2_ = uVar104;
  uVar104 = (undefined2)((ulong)uVar29 >> 0x20);
  auVar185._12_4_ = auVar186._12_4_;
  auVar185._8_2_ = 0;
  auVar185._0_8_ = uVar56;
  auVar185._10_2_ = uVar104;
  auVar184._10_6_ = auVar185._10_6_;
  auVar184._8_2_ = uVar104;
  auVar184._0_8_ = uVar56;
  uVar104 = (undefined2)uVar30;
  auVar39._4_8_ = auVar184._8_8_;
  auVar39._2_2_ = uVar104;
  auVar39._0_2_ = uVar104;
  fVar107 = (float)((int)sVar69 >> 8);
  fVar133 = (float)(auVar39._0_4_ >> 0x18);
  fVar134 = (float)(auVar184._8_4_ >> 0x18);
  fVar311 = fVar135 * fVar328 + fVar146 * fVar158 + fVar147 * fVar199;
  fVar322 = fVar135 * fVar333 + fVar146 * fVar169 + fVar147 * fVar202;
  fVar324 = fVar135 * fVar335 + fVar146 * fVar170 + fVar147 * fVar203;
  fVar326 = fVar135 * (float)(auVar137._12_4_ >> 0x18) +
            fVar146 * (float)(auVar109._12_4_ >> 0x18) + fVar147 * (float)(auVar112._12_4_ >> 0x18);
  fVar289 = fVar135 * fVar70 + fVar146 * fVar204 + fVar147 * fVar245;
  fVar302 = fVar135 * fVar105 + fVar146 * fVar217 + fVar147 * fVar260;
  fVar305 = fVar135 * fVar106 + fVar146 * fVar218 + fVar147 * fVar263;
  fVar308 = fVar135 * (float)(auVar115._12_4_ >> 0x18) +
            fVar146 * (float)(auVar173._12_4_ >> 0x18) + fVar147 * (float)(auVar176._12_4_ >> 0x18);
  fVar171 = fVar135 * fVar219 + fVar146 * fVar268 + fVar147 * fVar107;
  fVar197 = fVar135 * fVar229 + fVar146 * fVar281 + fVar147 * fVar133;
  fVar198 = fVar135 * fVar234 + fVar146 * fVar284 + fVar147 * fVar134;
  fVar135 = fVar135 * (float)(auVar179._12_4_ >> 0x18) +
            fVar146 * (float)(auVar182._12_4_ >> 0x18) + fVar147 * (float)(auVar185._12_4_ >> 0x18);
  fVar329 = fVar328 * fVar148 + fVar158 * fVar156 + fVar199 * fVar157;
  fVar333 = fVar333 * fVar148 + fVar169 * fVar156 + fVar202 * fVar157;
  fVar335 = fVar335 * fVar148 + fVar170 * fVar156 + fVar203 * fVar157;
  fVar337 = (float)(auVar137._12_4_ >> 0x18) * fVar148 +
            (float)(auVar109._12_4_ >> 0x18) * fVar156 + (float)(auVar112._12_4_ >> 0x18) * fVar157;
  fVar245 = fVar70 * fVar148 + fVar204 * fVar156 + fVar245 * fVar157;
  fVar260 = fVar105 * fVar148 + fVar217 * fVar156 + fVar260 * fVar157;
  fVar263 = fVar106 * fVar148 + fVar218 * fVar156 + fVar263 * fVar157;
  fVar328 = (float)(auVar115._12_4_ >> 0x18) * fVar148 +
            (float)(auVar173._12_4_ >> 0x18) * fVar156 + (float)(auVar176._12_4_ >> 0x18) * fVar157;
  fVar219 = fVar148 * fVar219 + fVar156 * fVar268 + fVar157 * fVar107;
  fVar229 = fVar148 * fVar229 + fVar156 * fVar281 + fVar157 * fVar133;
  fVar234 = fVar148 * fVar234 + fVar156 * fVar284 + fVar157 * fVar134;
  fVar268 = fVar148 * (float)(auVar179._12_4_ >> 0x18) +
            fVar156 * (float)(auVar182._12_4_ >> 0x18) + fVar157 * (float)(auVar185._12_4_ >> 0x18);
  fVar147 = (float)DAT_01f80d30;
  fVar70 = DAT_01f80d30._4_4_;
  fVar105 = DAT_01f80d30._8_4_;
  fVar106 = DAT_01f80d30._12_4_;
  uVar64 = -(uint)(fVar147 <= ABS(fVar311));
  uVar65 = -(uint)(fVar70 <= ABS(fVar322));
  uVar67 = -(uint)(fVar105 <= ABS(fVar324));
  uVar68 = -(uint)(fVar106 <= ABS(fVar326));
  auVar313._0_4_ = (uint)fVar311 & uVar64;
  auVar313._4_4_ = (uint)fVar322 & uVar65;
  auVar313._8_4_ = (uint)fVar324 & uVar67;
  auVar313._12_4_ = (uint)fVar326 & uVar68;
  auVar149._0_4_ = ~uVar64 & (uint)fVar147;
  auVar149._4_4_ = ~uVar65 & (uint)fVar70;
  auVar149._8_4_ = ~uVar67 & (uint)fVar105;
  auVar149._12_4_ = ~uVar68 & (uint)fVar106;
  auVar149 = auVar149 | auVar313;
  uVar64 = -(uint)(fVar147 <= ABS(fVar289));
  uVar65 = -(uint)(fVar70 <= ABS(fVar302));
  uVar67 = -(uint)(fVar105 <= ABS(fVar305));
  uVar68 = -(uint)(fVar106 <= ABS(fVar308));
  auVar292._0_4_ = (uint)fVar289 & uVar64;
  auVar292._4_4_ = (uint)fVar302 & uVar65;
  auVar292._8_4_ = (uint)fVar305 & uVar67;
  auVar292._12_4_ = (uint)fVar308 & uVar68;
  auVar200._0_4_ = ~uVar64 & (uint)fVar147;
  auVar200._4_4_ = ~uVar65 & (uint)fVar70;
  auVar200._8_4_ = ~uVar67 & (uint)fVar105;
  auVar200._12_4_ = ~uVar68 & (uint)fVar106;
  auVar200 = auVar200 | auVar292;
  uVar64 = -(uint)(fVar147 <= ABS(fVar171));
  uVar65 = -(uint)(fVar70 <= ABS(fVar197));
  uVar67 = -(uint)(fVar105 <= ABS(fVar198));
  uVar68 = -(uint)(fVar106 <= ABS(fVar135));
  auVar187._0_4_ = (uint)fVar171 & uVar64;
  auVar187._4_4_ = (uint)fVar197 & uVar65;
  auVar187._8_4_ = (uint)fVar198 & uVar67;
  auVar187._12_4_ = (uint)fVar135 & uVar68;
  auVar205._0_4_ = ~uVar64 & (uint)fVar147;
  auVar205._4_4_ = ~uVar65 & (uint)fVar70;
  auVar205._8_4_ = ~uVar67 & (uint)fVar105;
  auVar205._12_4_ = ~uVar68 & (uint)fVar106;
  auVar205 = auVar205 | auVar187;
  auVar71 = rcpps(_DAT_01f80d30,auVar149);
  fVar147 = auVar71._0_4_;
  fVar106 = auVar71._4_4_;
  fVar158 = auVar71._8_4_;
  fVar204 = auVar71._12_4_;
  fVar147 = (1.0 - auVar149._0_4_ * fVar147) * fVar147 + fVar147;
  fVar106 = (1.0 - auVar149._4_4_ * fVar106) * fVar106 + fVar106;
  fVar158 = (1.0 - auVar149._8_4_ * fVar158) * fVar158 + fVar158;
  fVar204 = (1.0 - auVar149._12_4_ * fVar204) * fVar204 + fVar204;
  auVar71 = rcpps(auVar71,auVar200);
  fVar70 = auVar71._0_4_;
  fVar107 = auVar71._4_4_;
  fVar169 = auVar71._8_4_;
  fVar217 = auVar71._12_4_;
  fVar70 = (1.0 - auVar200._0_4_ * fVar70) * fVar70 + fVar70;
  fVar107 = (1.0 - auVar200._4_4_ * fVar107) * fVar107 + fVar107;
  fVar169 = (1.0 - auVar200._8_4_ * fVar169) * fVar169 + fVar169;
  fVar217 = (1.0 - auVar200._12_4_ * fVar217) * fVar217 + fVar217;
  auVar71 = rcpps(auVar71,auVar205);
  fVar105 = auVar71._0_4_;
  fVar133 = auVar71._4_4_;
  fVar170 = auVar71._8_4_;
  fVar218 = auVar71._12_4_;
  fVar105 = (1.0 - auVar205._0_4_ * fVar105) * fVar105 + fVar105;
  fVar133 = (1.0 - auVar205._4_4_ * fVar133) * fVar133 + fVar133;
  fVar170 = (1.0 - auVar205._8_4_ * fVar170) * fVar170 + fVar170;
  fVar218 = (1.0 - auVar205._12_4_ * fVar218) * fVar218 + fVar218;
  fVar281 = (*(float *)(ray + k * 4 + 0x70) - *(float *)(prim + lVar57 + 0x16)) *
            *(float *)(prim + lVar57 + 0x1a);
  uVar56 = *(ulong *)(prim + uVar54 * 7 + 6);
  uVar104 = (undefined2)(uVar56 >> 0x30);
  auVar139._8_4_ = 0;
  auVar139._0_8_ = uVar56;
  auVar139._12_2_ = uVar104;
  auVar139._14_2_ = uVar104;
  uVar104 = (undefined2)(uVar56 >> 0x20);
  auVar254._12_4_ = auVar139._12_4_;
  auVar254._8_2_ = 0;
  auVar254._0_8_ = uVar56;
  auVar254._10_2_ = uVar104;
  auVar277._10_6_ = auVar254._10_6_;
  auVar277._8_2_ = uVar104;
  auVar277._0_8_ = uVar56;
  uVar104 = (undefined2)(uVar56 >> 0x10);
  auVar40._4_8_ = auVar277._8_8_;
  auVar40._2_2_ = uVar104;
  auVar40._0_2_ = uVar104;
  fVar134 = (float)(auVar40._0_4_ >> 0x10);
  fVar171 = (float)(auVar277._8_4_ >> 0x10);
  uVar55 = *(ulong *)(prim + uVar54 * 0xb + 6);
  uVar104 = (undefined2)(uVar55 >> 0x30);
  auVar152._8_4_ = 0;
  auVar152._0_8_ = uVar55;
  auVar152._12_2_ = uVar104;
  auVar152._14_2_ = uVar104;
  uVar104 = (undefined2)(uVar55 >> 0x20);
  auVar151._12_4_ = auVar152._12_4_;
  auVar151._8_2_ = 0;
  auVar151._0_8_ = uVar55;
  auVar151._10_2_ = uVar104;
  auVar150._10_6_ = auVar151._10_6_;
  auVar150._8_2_ = uVar104;
  auVar150._0_8_ = uVar55;
  uVar104 = (undefined2)(uVar55 >> 0x10);
  auVar41._4_8_ = auVar150._8_8_;
  auVar41._2_2_ = uVar104;
  auVar41._0_2_ = uVar104;
  uVar5 = *(ulong *)(prim + uVar54 * 9 + 6);
  uVar104 = (undefined2)(uVar5 >> 0x30);
  auVar73._8_4_ = 0;
  auVar73._0_8_ = uVar5;
  auVar73._12_2_ = uVar104;
  auVar73._14_2_ = uVar104;
  uVar104 = (undefined2)(uVar5 >> 0x20);
  auVar72._12_4_ = auVar73._12_4_;
  auVar72._8_2_ = 0;
  auVar72._0_8_ = uVar5;
  auVar72._10_2_ = uVar104;
  auVar301._10_6_ = auVar72._10_6_;
  auVar301._8_2_ = uVar104;
  auVar301._0_8_ = uVar5;
  uVar104 = (undefined2)(uVar5 >> 0x10);
  auVar42._4_8_ = auVar301._8_8_;
  auVar42._2_2_ = uVar104;
  auVar42._0_2_ = uVar104;
  fVar135 = (float)(auVar42._0_4_ >> 0x10);
  fVar197 = (float)(auVar301._8_4_ >> 0x10);
  uVar6 = *(ulong *)(prim + uVar54 * 0xd + 6);
  uVar104 = (undefined2)(uVar6 >> 0x30);
  auVar208._8_4_ = 0;
  auVar208._0_8_ = uVar6;
  auVar208._12_2_ = uVar104;
  auVar208._14_2_ = uVar104;
  uVar104 = (undefined2)(uVar6 >> 0x20);
  auVar207._12_4_ = auVar208._12_4_;
  auVar207._8_2_ = 0;
  auVar207._0_8_ = uVar6;
  auVar207._10_2_ = uVar104;
  auVar206._10_6_ = auVar207._10_6_;
  auVar206._8_2_ = uVar104;
  auVar206._0_8_ = uVar6;
  uVar104 = (undefined2)(uVar6 >> 0x10);
  auVar43._4_8_ = auVar206._8_8_;
  auVar43._2_2_ = uVar104;
  auVar43._0_2_ = uVar104;
  uVar7 = *(ulong *)(prim + uVar54 * 0x12 + 6);
  uVar104 = (undefined2)(uVar7 >> 0x30);
  auVar76._8_4_ = 0;
  auVar76._0_8_ = uVar7;
  auVar76._12_2_ = uVar104;
  auVar76._14_2_ = uVar104;
  uVar104 = (undefined2)(uVar7 >> 0x20);
  auVar75._12_4_ = auVar76._12_4_;
  auVar75._8_2_ = 0;
  auVar75._0_8_ = uVar7;
  auVar75._10_2_ = uVar104;
  auVar74._10_6_ = auVar75._10_6_;
  auVar74._8_2_ = uVar104;
  auVar74._0_8_ = uVar7;
  uVar104 = (undefined2)(uVar7 >> 0x10);
  auVar44._4_8_ = auVar74._8_8_;
  auVar44._2_2_ = uVar104;
  auVar44._0_2_ = uVar104;
  fVar146 = (float)(auVar44._0_4_ >> 0x10);
  fVar198 = (float)(auVar74._8_4_ >> 0x10);
  uVar62 = (ulong)(uint)((int)(uVar54 * 5) << 2);
  uVar8 = *(ulong *)(prim + uVar54 * 2 + uVar62 + 6);
  uVar104 = (undefined2)(uVar8 >> 0x30);
  auVar250._8_4_ = 0;
  auVar250._0_8_ = uVar8;
  auVar250._12_2_ = uVar104;
  auVar250._14_2_ = uVar104;
  uVar104 = (undefined2)(uVar8 >> 0x20);
  auVar249._12_4_ = auVar250._12_4_;
  auVar249._8_2_ = 0;
  auVar249._0_8_ = uVar8;
  auVar249._10_2_ = uVar104;
  auVar248._10_6_ = auVar249._10_6_;
  auVar248._8_2_ = uVar104;
  auVar248._0_8_ = uVar8;
  uVar104 = (undefined2)(uVar8 >> 0x10);
  auVar45._4_8_ = auVar248._8_8_;
  auVar45._2_2_ = uVar104;
  auVar45._0_2_ = uVar104;
  uVar62 = *(ulong *)(prim + uVar62 + 6);
  uVar104 = (undefined2)(uVar62 >> 0x30);
  auVar79._8_4_ = 0;
  auVar79._0_8_ = uVar62;
  auVar79._12_2_ = uVar104;
  auVar79._14_2_ = uVar104;
  uVar104 = (undefined2)(uVar62 >> 0x20);
  auVar78._12_4_ = auVar79._12_4_;
  auVar78._8_2_ = 0;
  auVar78._0_8_ = uVar62;
  auVar78._10_2_ = uVar104;
  auVar77._10_6_ = auVar78._10_6_;
  auVar77._8_2_ = uVar104;
  auVar77._0_8_ = uVar62;
  uVar104 = (undefined2)(uVar62 >> 0x10);
  auVar46._4_8_ = auVar77._8_8_;
  auVar46._2_2_ = uVar104;
  auVar46._0_2_ = uVar104;
  fVar148 = (float)(auVar46._0_4_ >> 0x10);
  fVar199 = (float)(auVar77._8_4_ >> 0x10);
  uVar9 = *(ulong *)(prim + uVar54 * 0x18 + 6);
  uVar104 = (undefined2)(uVar9 >> 0x30);
  auVar273._8_4_ = 0;
  auVar273._0_8_ = uVar9;
  auVar273._12_2_ = uVar104;
  auVar273._14_2_ = uVar104;
  uVar104 = (undefined2)(uVar9 >> 0x20);
  auVar272._12_4_ = auVar273._12_4_;
  auVar272._8_2_ = 0;
  auVar272._0_8_ = uVar9;
  auVar272._10_2_ = uVar104;
  auVar271._10_6_ = auVar272._10_6_;
  auVar271._8_2_ = uVar104;
  auVar271._0_8_ = uVar9;
  uVar104 = (undefined2)(uVar9 >> 0x10);
  auVar47._4_8_ = auVar271._8_8_;
  auVar47._2_2_ = uVar104;
  auVar47._0_2_ = uVar104;
  uVar10 = *(ulong *)(prim + uVar54 * 0x1d + 6);
  uVar104 = (undefined2)(uVar10 >> 0x30);
  auVar82._8_4_ = 0;
  auVar82._0_8_ = uVar10;
  auVar82._12_2_ = uVar104;
  auVar82._14_2_ = uVar104;
  uVar104 = (undefined2)(uVar10 >> 0x20);
  auVar81._12_4_ = auVar82._12_4_;
  auVar81._8_2_ = 0;
  auVar81._0_8_ = uVar10;
  auVar81._10_2_ = uVar104;
  auVar80._10_6_ = auVar81._10_6_;
  auVar80._8_2_ = uVar104;
  auVar80._0_8_ = uVar10;
  uVar104 = (undefined2)(uVar10 >> 0x10);
  auVar48._4_8_ = auVar80._8_8_;
  auVar48._2_2_ = uVar104;
  auVar48._0_2_ = uVar104;
  fVar156 = (float)(auVar48._0_4_ >> 0x10);
  fVar202 = (float)(auVar80._8_4_ >> 0x10);
  uVar11 = *(ulong *)(prim + uVar54 + (ulong)(byte)PVar13 * 0x20 + 6);
  uVar104 = (undefined2)(uVar11 >> 0x30);
  auVar295._8_4_ = 0;
  auVar295._0_8_ = uVar11;
  auVar295._12_2_ = uVar104;
  auVar295._14_2_ = uVar104;
  uVar104 = (undefined2)(uVar11 >> 0x20);
  auVar294._12_4_ = auVar295._12_4_;
  auVar294._8_2_ = 0;
  auVar294._0_8_ = uVar11;
  auVar294._10_2_ = uVar104;
  auVar293._10_6_ = auVar294._10_6_;
  auVar293._8_2_ = uVar104;
  auVar293._0_8_ = uVar11;
  uVar104 = (undefined2)(uVar11 >> 0x10);
  auVar49._4_8_ = auVar293._8_8_;
  auVar49._2_2_ = uVar104;
  auVar49._0_2_ = uVar104;
  uVar12 = *(ulong *)(prim + ((ulong)(byte)PVar13 * 0x20 - uVar54) + 6);
  uVar104 = (undefined2)(uVar12 >> 0x30);
  auVar85._8_4_ = 0;
  auVar85._0_8_ = uVar12;
  auVar85._12_2_ = uVar104;
  auVar85._14_2_ = uVar104;
  uVar104 = (undefined2)(uVar12 >> 0x20);
  auVar84._12_4_ = auVar85._12_4_;
  auVar84._8_2_ = 0;
  auVar84._0_8_ = uVar12;
  auVar84._10_2_ = uVar104;
  auVar83._10_6_ = auVar84._10_6_;
  auVar83._8_2_ = uVar104;
  auVar83._0_8_ = uVar12;
  uVar104 = (undefined2)(uVar12 >> 0x10);
  auVar50._4_8_ = auVar83._8_8_;
  auVar50._2_2_ = uVar104;
  auVar50._0_2_ = uVar104;
  fVar157 = (float)(auVar50._0_4_ >> 0x10);
  fVar203 = (float)(auVar83._8_4_ >> 0x10);
  uVar54 = *(ulong *)(prim + uVar54 * 0x23 + 6);
  uVar104 = (undefined2)(uVar54 >> 0x30);
  auVar316._8_4_ = 0;
  auVar316._0_8_ = uVar54;
  auVar316._12_2_ = uVar104;
  auVar316._14_2_ = uVar104;
  uVar104 = (undefined2)(uVar54 >> 0x20);
  auVar315._12_4_ = auVar316._12_4_;
  auVar315._8_2_ = 0;
  auVar315._0_8_ = uVar54;
  auVar315._10_2_ = uVar104;
  auVar314._10_6_ = auVar315._10_6_;
  auVar314._8_2_ = uVar104;
  auVar314._0_8_ = uVar54;
  uVar104 = (undefined2)(uVar54 >> 0x10);
  auVar51._4_8_ = auVar314._8_8_;
  auVar51._2_2_ = uVar104;
  auVar51._0_2_ = uVar104;
  auVar153._0_8_ =
       CONCAT44(((((float)(auVar41._0_4_ >> 0x10) - fVar134) * fVar281 + fVar134) - fVar333) *
                fVar106,((((float)(int)(short)uVar55 - (float)(int)(short)uVar56) * fVar281 +
                         (float)(int)(short)uVar56) - fVar329) * fVar147);
  auVar153._8_4_ =
       ((((float)(auVar150._8_4_ >> 0x10) - fVar171) * fVar281 + fVar171) - fVar335) * fVar158;
  auVar153._12_4_ =
       ((((float)(auVar151._12_4_ >> 0x10) - (float)(auVar254._12_4_ >> 0x10)) * fVar281 +
        (float)(auVar254._12_4_ >> 0x10)) - fVar337) * fVar204;
  auVar209._0_4_ =
       ((((float)(int)(short)uVar6 - (float)(int)(short)uVar5) * fVar281 + (float)(int)(short)uVar5)
       - fVar329) * fVar147;
  auVar209._4_4_ =
       ((((float)(auVar43._0_4_ >> 0x10) - fVar135) * fVar281 + fVar135) - fVar333) * fVar106;
  auVar209._8_4_ =
       ((((float)(auVar206._8_4_ >> 0x10) - fVar197) * fVar281 + fVar197) - fVar335) * fVar158;
  auVar209._12_4_ =
       ((((float)(auVar207._12_4_ >> 0x10) - (float)(auVar72._12_4_ >> 0x10)) * fVar281 +
        (float)(auVar72._12_4_ >> 0x10)) - fVar337) * fVar204;
  auVar251._0_8_ =
       CONCAT44(((((float)(auVar45._0_4_ >> 0x10) - fVar146) * fVar281 + fVar146) - fVar260) *
                fVar107,((((float)(int)(short)uVar8 - (float)(int)(short)uVar7) * fVar281 +
                         (float)(int)(short)uVar7) - fVar245) * fVar70);
  auVar251._8_4_ =
       ((((float)(auVar248._8_4_ >> 0x10) - fVar198) * fVar281 + fVar198) - fVar263) * fVar169;
  auVar251._12_4_ =
       ((((float)(auVar249._12_4_ >> 0x10) - (float)(auVar75._12_4_ >> 0x10)) * fVar281 +
        (float)(auVar75._12_4_ >> 0x10)) - fVar328) * fVar217;
  auVar274._0_4_ =
       ((((float)(int)(short)uVar9 - (float)(int)(short)uVar62) * fVar281 +
        (float)(int)(short)uVar62) - fVar245) * fVar70;
  auVar274._4_4_ =
       ((((float)(auVar47._0_4_ >> 0x10) - fVar148) * fVar281 + fVar148) - fVar260) * fVar107;
  auVar274._8_4_ =
       ((((float)(auVar271._8_4_ >> 0x10) - fVar199) * fVar281 + fVar199) - fVar263) * fVar169;
  auVar274._12_4_ =
       ((((float)(auVar272._12_4_ >> 0x10) - (float)(auVar78._12_4_ >> 0x10)) * fVar281 +
        (float)(auVar78._12_4_ >> 0x10)) - fVar328) * fVar217;
  uVar14 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar296._0_8_ =
       CONCAT44(((((float)(auVar49._0_4_ >> 0x10) - fVar156) * fVar281 + fVar156) - fVar229) *
                fVar133,((((float)(int)(short)uVar11 - (float)(int)(short)uVar10) * fVar281 +
                         (float)(int)(short)uVar10) - fVar219) * fVar105);
  auVar296._8_4_ =
       ((((float)(auVar293._8_4_ >> 0x10) - fVar202) * fVar281 + fVar202) - fVar234) * fVar170;
  auVar296._12_4_ =
       ((((float)(auVar294._12_4_ >> 0x10) - (float)(auVar81._12_4_ >> 0x10)) * fVar281 +
        (float)(auVar81._12_4_ >> 0x10)) - fVar268) * fVar218;
  auVar317._0_4_ =
       ((((float)(int)(short)uVar54 - (float)(int)(short)uVar12) * fVar281 +
        (float)(int)(short)uVar12) - fVar219) * fVar105;
  auVar317._4_4_ =
       ((((float)(auVar51._0_4_ >> 0x10) - fVar157) * fVar281 + fVar157) - fVar229) * fVar133;
  auVar317._8_4_ =
       ((((float)(auVar314._8_4_ >> 0x10) - fVar203) * fVar281 + fVar203) - fVar234) * fVar170;
  auVar317._12_4_ =
       ((((float)(auVar315._12_4_ >> 0x10) - (float)(auVar84._12_4_ >> 0x10)) * fVar281 +
        (float)(auVar84._12_4_ >> 0x10)) - fVar268) * fVar218;
  auVar136._8_4_ = auVar153._8_4_;
  auVar136._0_8_ = auVar153._0_8_;
  auVar136._12_4_ = auVar153._12_4_;
  auVar137 = minps(auVar136,auVar209);
  auVar117._8_4_ = auVar251._8_4_;
  auVar117._0_8_ = auVar251._0_8_;
  auVar117._12_4_ = auVar251._12_4_;
  auVar71 = minps(auVar117,auVar274);
  auVar137 = maxps(auVar137,auVar71);
  auVar118._8_4_ = auVar296._8_4_;
  auVar118._0_8_ = auVar296._0_8_;
  auVar118._12_4_ = auVar296._12_4_;
  auVar71 = minps(auVar118,auVar317);
  auVar86._4_4_ = uVar14;
  auVar86._0_4_ = uVar14;
  auVar86._8_4_ = uVar14;
  auVar86._12_4_ = uVar14;
  auVar71 = maxps(auVar71,auVar86);
  auVar71 = maxps(auVar137,auVar71);
  auVar137 = maxps(auVar153,auVar209);
  auVar252 = maxps(auVar251,auVar274);
  auVar137 = minps(auVar137,auVar252);
  local_288 = auVar71._0_4_ * 0.99999964;
  fStack_284 = auVar71._4_4_ * 0.99999964;
  fStack_280 = auVar71._8_4_ * 0.99999964;
  fStack_27c = auVar71._12_4_ * 0.99999964;
  auVar71 = maxps(auVar296,auVar317);
  uVar14 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar87._4_4_ = uVar14;
  auVar87._0_4_ = uVar14;
  auVar87._8_4_ = uVar14;
  auVar87._12_4_ = uVar14;
  auVar71 = minps(auVar71,auVar87);
  auVar71 = minps(auVar137,auVar71);
  uVar64 = (uint)(byte)PVar13;
  auVar119._0_4_ = -(uint)(uVar64 != 0 && local_288 <= auVar71._0_4_ * 1.0000004);
  auVar119._4_4_ = -(uint)(1 < uVar64 && fStack_284 <= auVar71._4_4_ * 1.0000004);
  auVar119._8_4_ = -(uint)(2 < uVar64 && fStack_280 <= auVar71._8_4_ * 1.0000004);
  auVar119._12_4_ = -(uint)(3 < uVar64 && fStack_27c <= auVar71._12_4_ * 1.0000004);
  uVar64 = movmskps(uVar64,auVar119);
  if (uVar64 == 0) {
    return false;
  }
  uVar64 = uVar64 & 0xff;
  local_390 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  local_268._0_4_ = -(uint)((int)mm_lookupmask_ps._240_4_ < 0);
  local_268._4_4_ = -(uint)((int)mm_lookupmask_ps._244_4_ < 0);
  local_268._8_4_ = -(uint)((int)mm_lookupmask_ps._248_4_ < 0);
  local_268._12_4_ = 0;
  local_388 = prim;
LAB_00b35611:
  uVar56 = (ulong)uVar64;
  lVar57 = 0;
  if (uVar56 != 0) {
    for (; (uVar64 >> lVar57 & 1) == 0; lVar57 = lVar57 + 1) {
    }
  }
  uVar65 = *(uint *)(local_388 + 2);
  uVar67 = *(uint *)(local_388 + lVar57 * 4 + 6);
  pGVar15 = (context->scene->geometries).items[uVar65].ptr;
  fVar147 = pGVar15->fnumTimeSegments;
  fVar70 = (pGVar15->time_range).lower;
  fVar105 = ((*(float *)(ray + k * 4 + 0x70) - fVar70) / ((pGVar15->time_range).upper - fVar70)) *
            fVar147;
  fVar70 = floorf(fVar105);
  fVar147 = fVar147 + -1.0;
  if (fVar147 <= fVar70) {
    fVar70 = fVar147;
  }
  fVar147 = 0.0;
  if (0.0 <= fVar70) {
    fVar147 = fVar70;
  }
  uVar55 = (ulong)*(uint *)(*(long *)&pGVar15->field_0x58 +
                           (ulong)uVar67 *
                           pGVar15[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  _Var16 = pGVar15[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar61 = (long)(int)fVar147 * 0x38;
  lVar17 = *(long *)(_Var16 + 0x10 + lVar61);
  pfVar1 = (float *)(*(long *)(_Var16 + lVar61) + lVar17 * uVar55);
  fVar70 = *pfVar1;
  fVar106 = pfVar1[1];
  fVar107 = pfVar1[2];
  fVar133 = pfVar1[3];
  lVar57 = uVar55 + 1;
  pfVar1 = (float *)(*(long *)(_Var16 + lVar61) + lVar17 * lVar57);
  fVar134 = *pfVar1;
  fVar135 = pfVar1[1];
  fVar146 = pfVar1[2];
  fVar148 = pfVar1[3];
  p_Var58 = pGVar15[4].occlusionFilterN;
  lVar17 = *(long *)&pGVar15[4].fnumTimeSegments;
  lVar18 = *(long *)(lVar17 + 0x10 + lVar61);
  pfVar1 = (float *)(*(long *)(lVar17 + lVar61) + lVar18 * uVar55);
  fVar156 = *pfVar1;
  fVar157 = pfVar1[1];
  fVar158 = pfVar1[2];
  fVar169 = pfVar1[3];
  pfVar1 = (float *)(*(long *)(lVar17 + lVar61) + lVar18 * lVar57);
  fVar170 = *pfVar1;
  fVar171 = pfVar1[1];
  fVar197 = pfVar1[2];
  fVar198 = pfVar1[3];
  _Var19 = pGVar15[5].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar18 = *(long *)(_Var19 + 0x10 + lVar61);
  pfVar1 = (float *)(*(long *)(_Var19 + lVar61) + lVar18 * uVar55);
  pfVar2 = (float *)(*(long *)(_Var19 + lVar61) + lVar18 * lVar57);
  pfVar3 = (float *)(*(long *)(p_Var58 + lVar61) + *(long *)(p_Var58 + lVar61 + 0x10) * uVar55);
  fVar105 = fVar105 - fVar147;
  fVar147 = *pfVar3 * 0.33333334 + fVar70;
  fVar199 = pfVar3[1] * 0.33333334 + fVar106;
  fVar202 = pfVar3[2] * 0.33333334 + fVar107;
  fVar203 = pfVar3[3] * 0.33333334 + fVar133;
  pfVar3 = (float *)(*(long *)(p_Var58 + lVar61) + *(long *)(p_Var58 + lVar61 + 0x10) * lVar57);
  fVar219 = fVar134 - *pfVar3 * 0.33333334;
  fVar281 = fVar135 - pfVar3[1] * 0.33333334;
  fVar302 = fVar146 - pfVar3[2] * 0.33333334;
  fVar308 = fVar148 - pfVar3[3] * 0.33333334;
  fVar245 = *pfVar1 * 0.33333334 + fVar156;
  fVar284 = pfVar1[1] * 0.33333334 + fVar157;
  fVar326 = pfVar1[2] * 0.33333334 + fVar158;
  fVar329 = pfVar1[3] * 0.33333334 + fVar169;
  fVar333 = fVar170 - *pfVar2 * 0.33333334;
  fVar337 = fVar171 - pfVar2[1] * 0.33333334;
  fVar235 = fVar197 - pfVar2[2] * 0.33333334;
  fVar240 = fVar198 - pfVar2[3] * 0.33333334;
  fVar204 = fVar219 * 0.0;
  fVar217 = fVar281 * 0.0;
  fVar218 = fVar302 * 0.0;
  fVar263 = fVar308 * 0.0;
  fVar260 = fVar134 * 0.0 + fVar204;
  fVar328 = fVar135 * 0.0 + fVar217;
  fVar229 = fVar146 * 0.0 + fVar218;
  fVar268 = fVar148 * 0.0 + fVar263;
  fVar269 = fVar147 * 0.0;
  fVar282 = fVar199 * 0.0;
  fVar285 = fVar202 * 0.0;
  fVar287 = fVar203 * 0.0;
  fVar234 = fVar269 + fVar260 + fVar70;
  fVar289 = fVar282 + fVar328 + fVar106;
  fVar305 = fVar285 + fVar229 + fVar107;
  fVar311 = fVar287 + fVar268 + fVar133;
  fVar260 = (fVar147 * 3.0 + fVar260) - fVar70 * 3.0;
  fVar328 = (fVar199 * 3.0 + fVar328) - fVar106 * 3.0;
  fVar229 = (fVar202 * 3.0 + fVar229) - fVar107 * 3.0;
  fVar268 = (fVar203 * 3.0 + fVar268) - fVar133 * 3.0;
  fVar270 = fVar333 * 0.0;
  fVar283 = fVar337 * 0.0;
  fVar286 = fVar235 * 0.0;
  fVar288 = fVar240 * 0.0;
  fVar147 = fVar170 * 0.0 + fVar270;
  fVar199 = fVar171 * 0.0 + fVar283;
  fVar202 = fVar197 * 0.0 + fVar286;
  fVar203 = fVar198 * 0.0 + fVar288;
  fVar290 = fVar245 * 0.0;
  fVar303 = fVar284 * 0.0;
  fVar306 = fVar326 * 0.0;
  fVar309 = fVar329 * 0.0;
  fVar335 = fVar290 + fVar147 + fVar156;
  fVar230 = fVar303 + fVar199 + fVar157;
  fVar236 = fVar306 + fVar202 + fVar158;
  fVar241 = fVar309 + fVar203 + fVar169;
  fVar322 = (fVar245 * 3.0 + fVar147) - fVar156 * 3.0;
  fVar324 = (fVar284 * 3.0 + fVar199) - fVar157 * 3.0;
  fVar326 = (fVar326 * 3.0 + fVar202) - fVar158 * 3.0;
  fVar329 = (fVar329 * 3.0 + fVar203) - fVar169 * 3.0;
  fVar203 = fVar204 + fVar134 + fVar269 + fVar70 * 0.0;
  fVar217 = fVar217 + fVar135 + fVar282 + fVar106 * 0.0;
  fVar245 = fVar218 + fVar146 + fVar285 + fVar107 * 0.0;
  fVar284 = fVar263 + fVar148 + fVar287 + fVar133 * 0.0;
  fVar199 = ((fVar134 * 3.0 - fVar219 * 3.0) + fVar269) - fVar70 * 0.0;
  fVar202 = ((fVar135 * 3.0 - fVar281 * 3.0) + fVar282) - fVar106 * 0.0;
  fVar204 = ((fVar146 * 3.0 - fVar302 * 3.0) + fVar285) - fVar107 * 0.0;
  fVar218 = ((fVar148 * 3.0 - fVar308 * 3.0) + fVar287) - fVar133 * 0.0;
  fVar107 = fVar270 + fVar170 + fVar290 + fVar156 * 0.0;
  fVar133 = fVar283 + fVar171 + fVar303 + fVar157 * 0.0;
  fVar134 = fVar286 + fVar197 + fVar306 + fVar158 * 0.0;
  fVar135 = fVar288 + fVar198 + fVar309 + fVar169 * 0.0;
  fVar147 = ((fVar170 * 3.0 - fVar333 * 3.0) + fVar290) - fVar156 * 0.0;
  fVar70 = ((fVar171 * 3.0 - fVar337 * 3.0) + fVar303) - fVar157 * 0.0;
  fVar106 = ((fVar197 * 3.0 - fVar235 * 3.0) + fVar306) - fVar158 * 0.0;
  fVar170 = ((fVar198 * 3.0 - fVar240 * 3.0) + fVar309) - fVar169 * 0.0;
  fVar235 = fVar328 * fVar335 - fVar230 * fVar260;
  fVar240 = fVar229 * fVar230 - fVar236 * fVar328;
  fVar236 = fVar260 * fVar236 - fVar335 * fVar229;
  fVar241 = fVar268 * fVar241 - fVar241 * fVar268;
  fVar219 = fVar328 * fVar322 - fVar324 * fVar260;
  fVar335 = fVar229 * fVar324 - fVar326 * fVar328;
  fVar326 = fVar260 * fVar326 - fVar322 * fVar229;
  fVar308 = fVar202 * fVar107 - fVar133 * fVar199;
  fVar322 = fVar204 * fVar133 - fVar134 * fVar202;
  fVar324 = fVar199 * fVar134 - fVar107 * fVar204;
  fVar333 = fVar218 * fVar135 - fVar135 * fVar218;
  fVar197 = fVar202 * fVar147 - fVar70 * fVar199;
  fVar198 = fVar204 * fVar70 - fVar106 * fVar202;
  fVar302 = fVar199 * fVar106 - fVar147 * fVar204;
  fVar169 = fVar236 * fVar236 + fVar240 * fVar240 + fVar235 * fVar235;
  auVar71 = ZEXT416((uint)fVar169);
  auVar137 = rsqrtss(ZEXT416((uint)fVar169),auVar71);
  fVar147 = auVar137._0_4_;
  fVar337 = fVar147 * 1.5 - fVar147 * fVar147 * fVar169 * 0.5 * fVar147;
  fVar269 = fVar235 * fVar219 + fVar236 * fVar326 + fVar240 * fVar335;
  fVar263 = fVar241 * fVar337;
  auVar71 = rcpss(auVar71,auVar71);
  fVar281 = (2.0 - fVar169 * auVar71._0_4_) * auVar71._0_4_;
  fVar230 = fVar324 * fVar324 + fVar322 * fVar322 + fVar308 * fVar308;
  auVar137 = ZEXT416((uint)fVar230);
  auVar71 = rsqrtss(ZEXT416((uint)fVar230),auVar137);
  fVar147 = auVar71._0_4_;
  fVar270 = fVar147 * 1.5 - fVar147 * fVar147 * fVar230 * 0.5 * fVar147;
  fVar282 = fVar308 * fVar197 + fVar324 * fVar302 + fVar322 * fVar198;
  lVar18 = *(long *)(_Var16 + 0x38 + lVar61);
  lVar20 = *(long *)(_Var16 + 0x48 + lVar61);
  pfVar1 = (float *)(lVar18 + lVar20 * uVar55);
  fVar147 = *pfVar1;
  fVar70 = pfVar1[1];
  fVar106 = pfVar1[2];
  fVar107 = pfVar1[3];
  pfVar1 = (float *)(lVar18 + lVar20 * lVar57);
  fVar133 = *pfVar1;
  fVar134 = pfVar1[1];
  fVar135 = pfVar1[2];
  fVar146 = pfVar1[3];
  lVar18 = *(long *)(lVar17 + 0x38 + lVar61);
  lVar17 = *(long *)(lVar17 + 0x48 + lVar61);
  pfVar1 = (float *)(lVar18 + lVar17 * lVar57);
  fVar148 = *pfVar1;
  fVar156 = pfVar1[1];
  fVar157 = pfVar1[2];
  fVar158 = pfVar1[3];
  lVar20 = *(long *)(_Var19 + 0x38 + lVar61);
  lVar21 = *(long *)(_Var19 + 0x48 + lVar61);
  auVar71 = rcpss(auVar137,auVar137);
  pfVar1 = (float *)(lVar20 + lVar21 * lVar57);
  fVar171 = fVar333 * fVar270;
  fVar283 = (2.0 - fVar230 * auVar71._0_4_) * auVar71._0_4_;
  fVar330 = fVar311 * fVar240 * fVar337;
  fVar334 = fVar311 * fVar236 * fVar337;
  fVar336 = fVar311 * fVar235 * fVar337;
  fVar338 = fVar311 * fVar263;
  fVar306 = fVar234 - fVar330;
  fVar231 = fVar289 - fVar334;
  fVar237 = fVar305 - fVar336;
  fVar242 = fVar311 - fVar338;
  fVar312 = fVar311 * fVar281 * (fVar169 * fVar335 - fVar269 * fVar240) * fVar337 +
            fVar268 * fVar240 * fVar337;
  fVar323 = fVar311 * fVar281 * (fVar169 * fVar326 - fVar269 * fVar236) * fVar337 +
            fVar268 * fVar236 * fVar337;
  fVar325 = fVar311 * fVar281 * (fVar169 * fVar219 - fVar269 * fVar235) * fVar337 +
            fVar268 * fVar235 * fVar337;
  fVar327 = fVar311 * fVar281 * (fVar169 * (fVar268 * fVar329 - fVar329 * fVar268) -
                                fVar269 * fVar241) * fVar337 + fVar268 * fVar263;
  fVar330 = fVar330 + fVar234;
  fVar334 = fVar334 + fVar289;
  fVar336 = fVar336 + fVar305;
  fVar338 = fVar338 + fVar311;
  fVar263 = fVar284 * fVar322 * fVar270;
  fVar219 = fVar284 * fVar324 * fVar270;
  fVar234 = fVar284 * fVar308 * fVar270;
  fVar281 = fVar284 * fVar171;
  pfVar2 = (float *)(*(long *)(p_Var58 + lVar61 + 0x38) +
                    *(long *)(p_Var58 + lVar61 + 0x48) * lVar57);
  fVar246 = fVar203 - fVar263;
  fVar261 = fVar217 - fVar219;
  fVar264 = fVar245 - fVar234;
  fVar266 = fVar284 - fVar281;
  fVar326 = fVar284 * fVar283 * (fVar230 * fVar198 - fVar282 * fVar322) * fVar270 +
            fVar218 * fVar322 * fVar270;
  fVar335 = fVar284 * fVar283 * (fVar230 * fVar302 - fVar282 * fVar324) * fVar270 +
            fVar218 * fVar324 * fVar270;
  fVar235 = fVar284 * fVar283 * (fVar230 * fVar197 - fVar282 * fVar308) * fVar270 +
            fVar218 * fVar308 * fVar270;
  fVar241 = fVar284 * fVar283 * (fVar230 * (fVar218 * fVar170 - fVar170 * fVar218) -
                                fVar282 * fVar333) * fVar270 + fVar218 * fVar171;
  fVar263 = fVar263 + fVar203;
  fVar219 = fVar219 + fVar217;
  fVar234 = fVar234 + fVar245;
  fVar281 = fVar281 + fVar284;
  fVar284 = fVar133 - *pfVar2 * 0.33333334;
  fVar302 = fVar134 - pfVar2[1] * 0.33333334;
  fVar308 = fVar135 - pfVar2[2] * 0.33333334;
  fVar322 = fVar146 - pfVar2[3] * 0.33333334;
  fVar282 = fVar148 - *pfVar1 * 0.33333334;
  fVar285 = fVar156 - pfVar1[1] * 0.33333334;
  fVar287 = fVar157 - pfVar1[2] * 0.33333334;
  fVar290 = fVar158 - pfVar1[3] * 0.33333334;
  fVar198 = fVar284 * 0.0;
  fVar203 = fVar302 * 0.0;
  fVar217 = fVar308 * 0.0;
  fVar245 = fVar322 * 0.0;
  fVar309 = fVar133 * 0.0 + fVar198;
  fVar232 = fVar134 * 0.0 + fVar203;
  fVar238 = fVar135 * 0.0 + fVar217;
  fVar243 = fVar146 * 0.0 + fVar245;
  pfVar1 = (float *)(*(long *)(p_Var58 + lVar61 + 0x38) +
                    *(long *)(p_Var58 + lVar61 + 0x48) * uVar55);
  fVar169 = *pfVar1 * 0.33333334 + fVar147;
  fVar170 = pfVar1[1] * 0.33333334 + fVar70;
  fVar171 = pfVar1[2] * 0.33333334 + fVar106;
  fVar197 = pfVar1[3] * 0.33333334 + fVar107;
  fVar329 = fVar169 * 0.0;
  fVar337 = fVar170 * 0.0;
  fVar236 = fVar171 * 0.0;
  fVar269 = fVar197 * 0.0;
  fVar289 = (fVar169 * 3.0 + fVar309) - fVar147 * 3.0;
  fVar305 = (fVar170 * 3.0 + fVar232) - fVar70 * 3.0;
  fVar311 = (fVar171 * 3.0 + fVar238) - fVar106 * 3.0;
  fVar324 = (fVar197 * 3.0 + fVar243) - fVar107 * 3.0;
  fVar247 = fVar282 * 0.0;
  fVar262 = fVar285 * 0.0;
  fVar265 = fVar287 * 0.0;
  fVar267 = fVar290 * 0.0;
  fVar220 = fVar148 * 0.0 + fVar247;
  fVar233 = fVar156 * 0.0 + fVar262;
  fVar239 = fVar157 * 0.0 + fVar265;
  fVar244 = fVar158 * 0.0 + fVar267;
  pfVar1 = (float *)(lVar20 + uVar55 * lVar21);
  pfVar2 = (float *)(lVar18 + lVar17 * uVar55);
  fVar169 = *pfVar2;
  fVar170 = pfVar2[1];
  fVar171 = pfVar2[2];
  fVar197 = pfVar2[3];
  fVar333 = *pfVar1 * 0.33333334 + fVar169;
  fVar230 = pfVar1[1] * 0.33333334 + fVar170;
  fVar240 = pfVar1[2] * 0.33333334 + fVar171;
  fVar270 = pfVar1[3] * 0.33333334 + fVar197;
  fVar291 = fVar333 * 0.0;
  fVar304 = fVar230 * 0.0;
  fVar307 = fVar240 * 0.0;
  fVar310 = fVar270 * 0.0;
  fVar283 = (fVar333 * 3.0 + fVar220) - fVar169 * 3.0;
  fVar286 = (fVar230 * 3.0 + fVar233) - fVar170 * 3.0;
  fVar288 = (fVar240 * 3.0 + fVar239) - fVar171 * 3.0;
  fVar303 = (fVar270 * 3.0 + fVar244) - fVar197 * 3.0;
  fVar333 = fVar329 + fVar309 + fVar147;
  fVar230 = fVar337 + fVar232 + fVar70;
  fVar240 = fVar236 + fVar238 + fVar106;
  fVar270 = fVar269 + fVar243 + fVar107;
  fVar198 = fVar198 + fVar133 + fVar329 + fVar147 * 0.0;
  fVar203 = fVar203 + fVar134 + fVar337 + fVar70 * 0.0;
  fVar217 = fVar217 + fVar135 + fVar236 + fVar106 * 0.0;
  fVar245 = fVar245 + fVar146 + fVar269 + fVar107 * 0.0;
  fVar147 = ((fVar133 * 3.0 - fVar284 * 3.0) + fVar329) - fVar147 * 0.0;
  fVar70 = ((fVar134 * 3.0 - fVar302 * 3.0) + fVar337) - fVar70 * 0.0;
  fVar106 = ((fVar135 * 3.0 - fVar308 * 3.0) + fVar236) - fVar106 * 0.0;
  fVar107 = ((fVar146 * 3.0 - fVar322 * 3.0) + fVar269) - fVar107 * 0.0;
  fVar329 = fVar291 + fVar220 + fVar169;
  fVar337 = fVar304 + fVar233 + fVar170;
  fVar236 = fVar307 + fVar239 + fVar171;
  fVar269 = fVar310 + fVar244 + fVar197;
  fVar134 = fVar247 + fVar148 + fVar291 + fVar169 * 0.0;
  fVar284 = fVar262 + fVar156 + fVar304 + fVar170 * 0.0;
  fVar302 = fVar265 + fVar157 + fVar307 + fVar171 * 0.0;
  fVar308 = fVar267 + fVar158 + fVar310 + fVar197 * 0.0;
  fVar133 = ((fVar148 * 3.0 - fVar282 * 3.0) + fVar291) - fVar169 * 0.0;
  fVar135 = ((fVar156 * 3.0 - fVar285 * 3.0) + fVar304) - fVar170 * 0.0;
  fVar146 = ((fVar157 * 3.0 - fVar287 * 3.0) + fVar307) - fVar171 * 0.0;
  fVar156 = ((fVar158 * 3.0 - fVar290 * 3.0) + fVar310) - fVar197 * 0.0;
  fVar322 = fVar305 * fVar329 - fVar337 * fVar289;
  fVar290 = fVar311 * fVar337 - fVar236 * fVar305;
  fVar309 = fVar289 * fVar236 - fVar329 * fVar311;
  fVar220 = fVar324 * fVar269 - fVar269 * fVar324;
  fVar169 = fVar305 * fVar283 - fVar286 * fVar289;
  fVar157 = fVar311 * fVar286 - fVar288 * fVar305;
  fVar170 = fVar289 * fVar288 - fVar283 * fVar311;
  fVar158 = fVar70 * fVar134 - fVar284 * fVar147;
  fVar171 = fVar106 * fVar284 - fVar302 * fVar70;
  fVar282 = fVar147 * fVar302 - fVar134 * fVar106;
  fVar285 = fVar107 * fVar308 - fVar308 * fVar107;
  fVar134 = fVar70 * fVar133 - fVar135 * fVar147;
  fVar135 = fVar106 * fVar135 - fVar146 * fVar70;
  fVar148 = fVar147 * fVar146 - fVar133 * fVar106;
  fVar133 = fVar309 * fVar309 + fVar290 * fVar290 + fVar322 * fVar322;
  auVar71 = ZEXT416((uint)fVar133);
  auVar137 = rsqrtss(ZEXT416((uint)fVar133),auVar71);
  fVar146 = auVar137._0_4_;
  fVar302 = fVar146 * 1.5 - fVar146 * fVar146 * fVar133 * 0.5 * fVar146;
  fVar308 = fVar322 * fVar169 + fVar309 * fVar170 + fVar290 * fVar157;
  auVar71 = rcpss(auVar71,auVar71);
  fVar197 = (2.0 - fVar133 * auVar71._0_4_) * auVar71._0_4_;
  fVar284 = fVar220 * fVar302;
  fVar287 = fVar282 * fVar282 + fVar171 * fVar171 + fVar158 * fVar158;
  auVar71 = ZEXT416((uint)fVar287);
  auVar137 = rsqrtss(ZEXT416((uint)fVar287),auVar71);
  fVar146 = auVar137._0_4_;
  fVar232 = fVar146 * 1.5 - fVar146 * fVar146 * fVar287 * 0.5 * fVar146;
  fVar233 = fVar158 * fVar134 + fVar282 * fVar148 + fVar171 * fVar135;
  auVar71 = rcpss(auVar71,auVar71);
  fVar238 = (2.0 - fVar287 * auVar71._0_4_) * auVar71._0_4_;
  fVar288 = fVar285 * fVar232;
  fVar329 = fVar270 * fVar290 * fVar302;
  fVar337 = fVar270 * fVar309 * fVar302;
  fVar236 = fVar270 * fVar322 * fVar302;
  fVar269 = fVar270 * fVar284;
  fVar146 = fVar270 * fVar197 * (fVar133 * fVar157 - fVar308 * fVar290) * fVar302 +
            fVar324 * fVar290 * fVar302;
  fVar157 = fVar270 * fVar197 * (fVar133 * fVar170 - fVar308 * fVar309) * fVar302 +
            fVar324 * fVar309 * fVar302;
  fVar170 = fVar270 * fVar197 * (fVar133 * fVar169 - fVar308 * fVar322) * fVar302 +
            fVar324 * fVar322 * fVar302;
  fVar322 = fVar270 * fVar197 * (fVar133 * (fVar324 * fVar303 - fVar303 * fVar324) -
                                fVar308 * fVar220) * fVar302 + fVar324 * fVar284;
  fVar169 = fVar333 - fVar329;
  fVar197 = fVar230 - fVar337;
  fVar283 = fVar240 - fVar236;
  fVar286 = fVar270 - fVar269;
  fVar329 = fVar329 + fVar333;
  fVar337 = fVar337 + fVar230;
  fVar236 = fVar236 + fVar240;
  fVar269 = fVar269 + fVar270;
  fVar133 = fVar245 * fVar171 * fVar232;
  fVar284 = fVar245 * fVar282 * fVar232;
  fVar302 = fVar245 * fVar158 * fVar232;
  fVar308 = fVar245 * fVar288;
  fVar333 = fVar245 * fVar238 * (fVar287 * fVar135 - fVar233 * fVar171) * fVar232 +
            fVar107 * fVar171 * fVar232;
  fVar230 = fVar245 * fVar238 * (fVar287 * fVar148 - fVar233 * fVar282) * fVar232 +
            fVar107 * fVar282 * fVar232;
  fVar240 = fVar245 * fVar238 * (fVar287 * fVar134 - fVar233 * fVar158) * fVar232 +
            fVar107 * fVar158 * fVar232;
  fVar270 = fVar245 * fVar238 * (fVar287 * (fVar107 * fVar156 - fVar156 * fVar107) -
                                fVar233 * fVar285) * fVar232 + fVar107 * fVar288;
  fVar134 = fVar198 - fVar133;
  fVar135 = fVar203 - fVar284;
  fVar156 = fVar217 - fVar302;
  fVar171 = fVar245 - fVar308;
  fVar133 = fVar133 + fVar198;
  fVar284 = fVar284 + fVar203;
  fVar302 = fVar302 + fVar217;
  fVar308 = fVar308 + fVar245;
  fVar203 = 1.0 - fVar105;
  fVar217 = fVar306 * fVar203 + fVar169 * fVar105;
  fVar245 = fVar231 * fVar203 + fVar197 * fVar105;
  fVar282 = fVar237 * fVar203 + fVar283 * fVar105;
  fVar285 = fVar242 * fVar203 + fVar286 * fVar105;
  fVar287 = ((fVar260 - fVar312) * 0.33333334 + fVar306) * fVar203 +
            ((fVar289 - fVar146) * 0.33333334 + fVar169) * fVar105;
  fVar288 = ((fVar328 - fVar323) * 0.33333334 + fVar231) * fVar203 +
            ((fVar305 - fVar157) * 0.33333334 + fVar197) * fVar105;
  fVar283 = ((fVar229 - fVar325) * 0.33333334 + fVar237) * fVar203 +
            ((fVar311 - fVar170) * 0.33333334 + fVar283) * fVar105;
  fVar286 = ((fVar268 - fVar327) * 0.33333334 + fVar242) * fVar203 +
            ((fVar324 - fVar322) * 0.33333334 + fVar286) * fVar105;
  fVar290 = (fVar246 - (fVar199 - fVar326) * 0.33333334) * fVar203 +
            (fVar134 - (fVar147 - fVar333) * 0.33333334) * fVar105;
  fVar303 = (fVar261 - (fVar202 - fVar335) * 0.33333334) * fVar203 +
            (fVar135 - (fVar70 - fVar230) * 0.33333334) * fVar105;
  fVar306 = (fVar264 - (fVar204 - fVar235) * 0.33333334) * fVar203 +
            (fVar156 - (fVar106 - fVar240) * 0.33333334) * fVar105;
  fVar309 = (fVar266 - (fVar218 - fVar241) * 0.33333334) * fVar203 +
            (fVar171 - (fVar107 - fVar270) * 0.33333334) * fVar105;
  fVar134 = fVar246 * fVar203 + fVar134 * fVar105;
  fVar148 = fVar261 * fVar203 + fVar135 * fVar105;
  fVar158 = fVar264 * fVar203 + fVar156 * fVar105;
  fVar171 = fVar266 * fVar203 + fVar171 * fVar105;
  fVar135 = fVar330 * fVar203 + fVar329 * fVar105;
  fVar156 = fVar334 * fVar203 + fVar337 * fVar105;
  fVar169 = fVar336 * fVar203 + fVar236 * fVar105;
  fVar197 = fVar338 * fVar203 + fVar269 * fVar105;
  fVar289 = ((fVar312 + fVar260) * 0.33333334 + fVar330) * fVar203 +
            ((fVar146 + fVar289) * 0.33333334 + fVar329) * fVar105;
  fVar305 = ((fVar323 + fVar328) * 0.33333334 + fVar334) * fVar203 +
            ((fVar157 + fVar305) * 0.33333334 + fVar337) * fVar105;
  fVar311 = ((fVar325 + fVar229) * 0.33333334 + fVar336) * fVar203 +
            ((fVar170 + fVar311) * 0.33333334 + fVar236) * fVar105;
  fVar322 = ((fVar327 + fVar268) * 0.33333334 + fVar338) * fVar203 +
            ((fVar322 + fVar324) * 0.33333334 + fVar269) * fVar105;
  fVar146 = (fVar263 - (fVar326 + fVar199) * 0.33333334) * fVar203 +
            (fVar133 - (fVar333 + fVar147) * 0.33333334) * fVar105;
  fVar157 = (fVar219 - (fVar335 + fVar202) * 0.33333334) * fVar203 +
            (fVar284 - (fVar230 + fVar70) * 0.33333334) * fVar105;
  fVar170 = (fVar234 - (fVar235 + fVar204) * 0.33333334) * fVar203 +
            (fVar302 - (fVar240 + fVar106) * 0.33333334) * fVar105;
  fVar198 = (fVar281 - (fVar241 + fVar218) * 0.33333334) * fVar203 +
            (fVar308 - (fVar270 + fVar107) * 0.33333334) * fVar105;
  local_278 = fVar203 * fVar263 + fVar105 * fVar133;
  fStack_274 = fVar203 * fVar219 + fVar105 * fVar284;
  fStack_270 = fVar203 * fVar234 + fVar105 * fVar302;
  fStack_26c = fVar203 * fVar281 + fVar105 * fVar308;
  local_1b8 = *(float *)(ray + k * 4);
  fStack_1b4 = *(float *)(ray + k * 4 + 0x10);
  fStack_1b0 = *(float *)(ray + k * 4 + 0x20);
  local_148 = fVar217 - local_1b8;
  fStack_144 = fVar245 - fStack_1b4;
  fStack_140 = fVar282 - fStack_1b0;
  fStack_13c = fVar285 - 0.0;
  fVar147 = pre->ray_space[k].vx.field_0.m128[0];
  fVar70 = pre->ray_space[k].vx.field_0.m128[1];
  fVar105 = pre->ray_space[k].vy.field_0.m128[0];
  fVar106 = pre->ray_space[k].vy.field_0.m128[1];
  fVar107 = pre->ray_space[k].vz.field_0.m128[0];
  fVar133 = pre->ray_space[k].vz.field_0.m128[1];
  fVar203 = local_148 * fVar147 + fStack_144 * fVar105 + fStack_140 * fVar107;
  fVar204 = local_148 * fVar70 + fStack_144 * fVar106 + fStack_140 * fVar133;
  auVar88._4_4_ = fVar204;
  auVar88._0_4_ = fVar203;
  local_158 = fVar287 - local_1b8;
  fStack_154 = fVar288 - fStack_1b4;
  fStack_150 = fVar283 - fStack_1b0;
  fStack_14c = fVar286 - 0.0;
  fVar199 = local_158 * fVar147 + fStack_154 * fVar105 + fStack_150 * fVar107;
  fVar202 = local_158 * fVar70 + fStack_154 * fVar106 + fStack_150 * fVar133;
  auVar318._4_4_ = fVar202;
  auVar318._0_4_ = fVar199;
  local_168 = fVar290 - local_1b8;
  fStack_164 = fVar303 - fStack_1b4;
  fStack_160 = fVar306 - fStack_1b0;
  fStack_15c = fVar309 - 0.0;
  fVar281 = local_168 * fVar147 + fStack_164 * fVar105 + fStack_160 * fVar107;
  fVar284 = local_168 * fVar70 + fStack_164 * fVar106 + fStack_160 * fVar133;
  local_338 = CONCAT44(fVar284,fVar281);
  local_178 = fVar134 - local_1b8;
  fStack_174 = fVar148 - fStack_1b4;
  fStack_170 = fVar158 - fStack_1b0;
  fStack_16c = fVar171 - 0.0;
  fVar234 = local_178 * fVar147 + fStack_174 * fVar105 + fStack_170 * fVar107;
  fVar268 = local_178 * fVar70 + fStack_174 * fVar106 + fStack_170 * fVar133;
  local_518._4_4_ = fVar268;
  local_518._0_4_ = fVar234;
  local_188 = fVar135 - local_1b8;
  fStack_184 = fVar156 - fStack_1b4;
  fStack_180 = fVar169 - fStack_1b0;
  fStack_17c = fVar197 - 0.0;
  fVar219 = local_188 * fVar147 + fStack_184 * fVar105 + fStack_180 * fVar107;
  fVar229 = local_188 * fVar70 + fStack_184 * fVar106 + fStack_180 * fVar133;
  local_198 = fVar289 - local_1b8;
  fStack_194 = fVar305 - fStack_1b4;
  fStack_190 = fVar311 - fStack_1b0;
  fStack_18c = fVar322 - 0.0;
  fVar218 = local_198 * fVar147 + fStack_194 * fVar105 + fStack_190 * fVar107;
  fVar260 = local_198 * fVar70 + fStack_194 * fVar106 + fStack_190 * fVar133;
  auVar318._12_4_ = fVar260;
  auVar318._8_4_ = fVar218;
  local_1a8 = fVar146 - local_1b8;
  fStack_1a4 = fVar157 - fStack_1b4;
  fStack_1a0 = fVar170 - fStack_1b0;
  fStack_19c = fVar198 - 0.0;
  fVar263 = local_1a8 * fVar147 + fStack_1a4 * fVar105 + fStack_1a0 * fVar107;
  fVar328 = local_1a8 * fVar70 + fStack_1a4 * fVar106 + fStack_1a0 * fVar133;
  local_1b8 = local_278 - local_1b8;
  fStack_1b4 = fStack_274 - fStack_1b4;
  fStack_1b0 = fStack_270 - fStack_1b0;
  fStack_1ac = fStack_26c - 0.0;
  fVar147 = local_1b8 * fVar147 + fStack_1b4 * fVar105 + fStack_1b0 * fVar107;
  fVar70 = local_1b8 * fVar70 + fStack_1b4 * fVar106 + fStack_1b0 * fVar133;
  fStack_50c = fVar70;
  fStack_510 = fVar147;
  auVar88._8_4_ = fVar219;
  auVar88._12_4_ = fVar229;
  auVar71 = minps(auVar88,auVar318);
  auVar120._8_4_ = fVar263;
  auVar120._0_8_ = local_338;
  auVar120._12_4_ = fVar328;
  auVar137 = minps(auVar120,_local_518);
  auVar71 = minps(auVar71,auVar137);
  auVar121._4_4_ = fVar204;
  auVar121._0_4_ = fVar203;
  auVar121._8_4_ = fVar219;
  auVar121._12_4_ = fVar229;
  auVar137 = maxps(auVar121,auVar318);
  auVar138._4_4_ = fVar284;
  auVar138._0_4_ = fVar281;
  auVar138._8_4_ = fVar263;
  auVar138._12_4_ = fVar328;
  auVar139 = maxps(auVar138,_local_518);
  auVar252 = maxps(auVar137,auVar139);
  auVar22._4_8_ = auVar139._8_8_;
  auVar22._0_4_ = auVar71._4_4_;
  auVar140._0_8_ = auVar22._0_8_ << 0x20;
  auVar140._8_4_ = auVar71._8_4_;
  auVar140._12_4_ = auVar71._12_4_;
  auVar141._8_8_ = auVar71._8_8_;
  auVar141._0_8_ = auVar140._8_8_;
  auVar137 = minps(auVar71,auVar141);
  auVar23._4_8_ = auVar71._8_8_;
  auVar23._0_4_ = auVar252._4_4_;
  auVar142._0_8_ = auVar23._0_8_ << 0x20;
  auVar142._8_4_ = auVar252._8_4_;
  auVar142._12_4_ = auVar252._12_4_;
  auVar143._8_8_ = auVar252._8_8_;
  auVar143._0_8_ = auVar142._8_8_;
  auVar71 = maxps(auVar252,auVar143);
  auVar89._0_8_ = auVar137._0_8_ & 0x7fffffff7fffffff;
  auVar89._8_4_ = auVar137._8_4_ & 0x7fffffff;
  auVar89._12_4_ = auVar137._12_4_ & 0x7fffffff;
  auVar122._0_8_ = auVar71._0_8_ & 0x7fffffff7fffffff;
  auVar122._8_4_ = auVar71._8_4_ & 0x7fffffff;
  auVar122._12_4_ = auVar71._12_4_ & 0x7fffffff;
  auVar71 = maxps(auVar89,auVar122);
  local_248 = auVar71._4_4_;
  if (auVar71._4_4_ <= auVar71._0_4_) {
    local_248 = auVar71._0_4_;
  }
  local_248 = local_248 * 9.536743e-07;
  fStack_244 = local_248;
  fStack_240 = local_248;
  fStack_23c = local_248;
  local_258 = -local_248;
  fStack_254 = -local_248;
  fStack_250 = -local_248;
  fStack_24c = -local_248;
  local_118 = fVar199 - fVar203;
  fStack_114 = fVar202 - fVar204;
  fStack_110 = fVar218 - fVar219;
  fStack_10c = fVar260 - fVar229;
  local_128 = fVar281 - fVar199;
  fStack_124 = fVar284 - fVar202;
  fStack_120 = fVar263 - fVar218;
  fStack_11c = fVar328 - fVar260;
  afStack_328[0] = fVar263;
  afStack_328[1] = fVar328;
  local_138 = fVar234 - fVar281;
  fStack_134 = fVar268 - fVar284;
  fStack_130 = fVar147 - fVar263;
  fStack_12c = fVar70 - fVar328;
  local_298 = fVar135 - fVar217;
  fStack_294 = fVar156 - fVar245;
  fStack_290 = fVar169 - fVar282;
  fStack_28c = fVar197 - fVar285;
  local_2a8 = fVar289 - fVar287;
  fStack_2a4 = fVar305 - fVar288;
  fStack_2a0 = fVar311 - fVar283;
  fStack_29c = fVar322 - fVar286;
  local_2b8 = fVar146 - fVar290;
  fStack_2b4 = fVar157 - fVar303;
  fStack_2b0 = fVar170 - fVar306;
  fStack_2ac = fVar198 - fVar309;
  local_2c8 = local_278 - fVar134;
  fStack_2c4 = fStack_274 - fVar148;
  fStack_2c0 = fStack_270 - fVar158;
  fStack_2bc = fStack_26c - fVar171;
  local_2d8 = uVar65;
  uStack_2d4 = uVar65;
  uStack_2d0 = uVar65;
  uStack_2cc = uVar65;
  local_2e8 = uVar67;
  uStack_2e4 = uVar67;
  uStack_2e0 = uVar67;
  uStack_2dc = uVar67;
  bVar60 = false;
  uVar67 = 0;
  fVar105 = *(float *)(ray + k * 4 + 0x30);
  fVar133 = 0.0;
  fVar171 = 1.0;
  fVar106 = 0.0;
  fVar107 = 1.0;
  local_380 = (ulong)uVar65;
LAB_00b36401:
  do {
    fVar197 = 1.0 - fVar106;
    fVar198 = 1.0 - fVar106;
    fVar302 = 1.0 - fVar107;
    fVar308 = 1.0 - fVar107;
    fVar269 = fVar203 * fVar197 + fVar219 * fVar106;
    fVar231 = fVar204 * fVar198 + fVar229 * fVar106;
    fVar232 = fVar203 * fVar302 + fVar219 * fVar107;
    fVar233 = fVar204 * fVar308 + fVar229 * fVar107;
    fVar326 = fVar199 * fVar197 + fVar218 * fVar106;
    fVar286 = fVar202 * fVar198 + fVar260 * fVar106;
    fVar309 = fVar199 * fVar302 + fVar218 * fVar107;
    fVar220 = fVar202 * fVar308 + fVar260 * fVar107;
    fVar242 = fVar281 * fVar197 + fVar263 * fVar106;
    fVar243 = fVar284 * fVar198 + fVar328 * fVar106;
    fVar267 = fVar281 * fVar302 + fVar263 * fVar107;
    fVar291 = fVar284 * fVar308 + fVar328 * fVar107;
    fVar237 = fVar197 * fVar234 + fVar106 * fVar147;
    fVar238 = fVar198 * fVar268 + fVar106 * fVar70;
    fVar239 = fVar302 * fVar234 + fVar107 * fVar147;
    fVar247 = fVar308 * fVar268 + fVar107 * fVar70;
    fVar261 = (fVar171 - fVar133) * 0.11111111;
    fVar262 = (fVar171 - fVar133) * 0.0 + fVar133;
    fVar264 = (fVar171 - fVar133) * 0.33333334 + fVar133;
    fVar265 = (fVar171 - fVar133) * 0.6666667 + fVar133;
    fVar266 = (fVar171 - fVar133) * 1.0 + fVar133;
    fVar198 = 1.0 - fVar262;
    fVar308 = 1.0 - fVar264;
    fVar324 = 1.0 - fVar265;
    fVar329 = 1.0 - fVar266;
    fVar333 = fVar326 * fVar198 + fVar242 * fVar262;
    fVar335 = fVar326 * fVar308 + fVar242 * fVar264;
    fVar337 = fVar326 * fVar324 + fVar242 * fVar265;
    fVar230 = fVar326 * fVar329 + fVar242 * fVar266;
    fVar235 = fVar286 * fVar198 + fVar243 * fVar262;
    fVar236 = fVar286 * fVar308 + fVar243 * fVar264;
    fVar240 = fVar286 * fVar324 + fVar243 * fVar265;
    fVar241 = fVar286 * fVar329 + fVar243 * fVar266;
    fVar197 = (fVar269 * fVar198 + fVar326 * fVar262) * fVar198 + fVar262 * fVar333;
    fVar302 = (fVar269 * fVar308 + fVar326 * fVar264) * fVar308 + fVar264 * fVar335;
    fVar322 = (fVar269 * fVar324 + fVar326 * fVar265) * fVar324 + fVar265 * fVar337;
    fVar326 = (fVar269 * fVar329 + fVar326 * fVar266) * fVar329 + fVar266 * fVar230;
    fVar269 = (fVar231 * fVar198 + fVar286 * fVar262) * fVar198 + fVar262 * fVar235;
    fVar270 = (fVar231 * fVar308 + fVar286 * fVar264) * fVar308 + fVar264 * fVar236;
    fVar285 = (fVar231 * fVar324 + fVar286 * fVar265) * fVar324 + fVar265 * fVar240;
    fVar286 = (fVar231 * fVar329 + fVar286 * fVar266) * fVar329 + fVar266 * fVar241;
    fVar333 = fVar333 * fVar198 + (fVar242 * fVar198 + fVar237 * fVar262) * fVar262;
    fVar335 = fVar335 * fVar308 + (fVar242 * fVar308 + fVar237 * fVar264) * fVar264;
    fVar337 = fVar337 * fVar324 + (fVar242 * fVar324 + fVar237 * fVar265) * fVar265;
    fVar230 = fVar230 * fVar329 + (fVar242 * fVar329 + fVar237 * fVar266) * fVar266;
    fVar235 = fVar235 * fVar198 + (fVar243 * fVar198 + fVar238 * fVar262) * fVar262;
    fVar236 = fVar236 * fVar308 + (fVar243 * fVar308 + fVar238 * fVar264) * fVar264;
    fVar240 = fVar240 * fVar324 + (fVar243 * fVar324 + fVar238 * fVar265) * fVar265;
    fVar241 = fVar241 * fVar329 + (fVar243 * fVar329 + fVar238 * fVar266) * fVar266;
    local_378 = fVar198 * fVar197 + fVar262 * fVar333;
    fStack_374 = fVar308 * fVar302 + fVar264 * fVar335;
    fStack_370 = fVar324 * fVar322 + fVar265 * fVar337;
    fStack_36c = fVar329 * fVar326 + fVar266 * fVar230;
    local_238 = fVar198 * fVar269 + fVar262 * fVar235;
    fStack_234 = fVar308 * fVar270 + fVar264 * fVar236;
    fStack_230 = fVar324 * fVar285 + fVar265 * fVar240;
    fStack_22c = fVar329 * fVar286 + fVar266 * fVar241;
    fVar335 = (fVar335 - fVar302) * 3.0 * fVar261;
    fVar337 = (fVar337 - fVar322) * 3.0 * fVar261;
    fVar230 = (fVar230 - fVar326) * 3.0 * fVar261;
    fVar236 = (fVar236 - fVar270) * 3.0 * fVar261;
    fVar240 = (fVar240 - fVar285) * 3.0 * fVar261;
    fVar241 = (fVar241 - fVar286) * 3.0 * fVar261;
    local_348._4_4_ = fStack_370;
    local_348._0_4_ = fStack_374;
    local_348._8_4_ = fStack_36c;
    local_348._12_4_ = 0;
    local_1d8._4_4_ = fStack_230;
    local_1d8._0_4_ = fStack_234;
    local_358 = local_378 + (fVar333 - fVar197) * 3.0 * fVar261;
    fStack_354 = fStack_374 + fVar335;
    fStack_350 = fStack_370 + fVar337;
    fStack_34c = fStack_36c + fVar230;
    fVar197 = local_238 + (fVar235 - fVar269) * 3.0 * fVar261;
    fVar302 = fStack_234 + fVar236;
    fVar322 = fStack_230 + fVar240;
    fVar326 = fStack_22c + fVar241;
    local_368._0_4_ = fStack_374 - fVar335;
    local_368._4_4_ = fStack_370 - fVar337;
    local_368._8_4_ = fStack_36c - fVar230;
    local_368._12_4_ = 0;
    local_528._0_4_ = fStack_234 - fVar236;
    local_528._4_4_ = fStack_230 - fVar240;
    fStack_520 = fStack_22c - fVar241;
    fStack_51c = 0.0;
    fVar333 = fVar309 * fVar198 + fVar267 * fVar262;
    fVar335 = fVar309 * fVar308 + fVar267 * fVar264;
    fVar337 = fVar309 * fVar324 + fVar267 * fVar265;
    fVar230 = fVar309 * fVar329 + fVar267 * fVar266;
    fVar235 = fVar220 * fVar198 + fVar291 * fVar262;
    fVar236 = fVar220 * fVar308 + fVar291 * fVar264;
    fVar240 = fVar220 * fVar324 + fVar291 * fVar265;
    fVar241 = fVar220 * fVar329 + fVar291 * fVar266;
    fVar269 = (fVar232 * fVar198 + fVar309 * fVar262) * fVar198 + fVar262 * fVar333;
    fVar270 = (fVar232 * fVar308 + fVar309 * fVar264) * fVar308 + fVar264 * fVar335;
    fVar285 = (fVar232 * fVar324 + fVar309 * fVar265) * fVar324 + fVar265 * fVar337;
    fVar286 = (fVar232 * fVar329 + fVar309 * fVar266) * fVar329 + fVar266 * fVar230;
    fVar242 = (fVar233 * fVar198 + fVar220 * fVar262) * fVar198 + fVar262 * fVar235;
    fVar243 = (fVar233 * fVar308 + fVar220 * fVar264) * fVar308 + fVar264 * fVar236;
    fVar244 = (fVar233 * fVar324 + fVar220 * fVar265) * fVar324 + fVar265 * fVar240;
    fVar246 = (fVar233 * fVar329 + fVar220 * fVar266) * fVar329 + fVar266 * fVar241;
    fVar309 = fVar333 * fVar198 + (fVar267 * fVar198 + fVar239 * fVar262) * fVar262;
    fVar220 = fVar335 * fVar308 + (fVar267 * fVar308 + fVar239 * fVar264) * fVar264;
    fVar231 = fVar337 * fVar324 + (fVar267 * fVar324 + fVar239 * fVar265) * fVar265;
    fVar232 = fVar230 * fVar329 + (fVar267 * fVar329 + fVar239 * fVar266) * fVar266;
    fVar233 = fVar235 * fVar198 + (fVar291 * fVar198 + fVar247 * fVar262) * fVar262;
    fVar237 = fVar236 * fVar308 + (fVar291 * fVar308 + fVar247 * fVar264) * fVar264;
    fVar238 = fVar240 * fVar324 + (fVar291 * fVar324 + fVar247 * fVar265) * fVar265;
    fVar239 = fVar241 * fVar329 + (fVar291 * fVar329 + fVar247 * fVar266) * fVar266;
    fVar235 = fVar198 * fVar269 + fVar262 * fVar309;
    fVar236 = fVar308 * fVar270 + fVar264 * fVar220;
    fVar240 = fVar324 * fVar285 + fVar265 * fVar231;
    fVar241 = fVar329 * fVar286 + fVar266 * fVar232;
    fVar333 = fVar198 * fVar242 + fVar262 * fVar233;
    fVar335 = fVar308 * fVar243 + fVar264 * fVar237;
    fVar337 = fVar324 * fVar244 + fVar265 * fVar238;
    fVar230 = fVar329 * fVar246 + fVar266 * fVar239;
    fVar198 = (fVar220 - fVar270) * 3.0 * fVar261;
    fVar308 = (fVar231 - fVar285) * 3.0 * fVar261;
    fVar324 = (fVar232 - fVar286) * 3.0 * fVar261;
    fVar329 = (fVar237 - fVar243) * 3.0 * fVar261;
    fVar270 = (fVar238 - fVar244) * 3.0 * fVar261;
    fVar285 = (fVar239 - fVar246) * 3.0 * fVar261;
    local_1e8._4_4_ = fVar240;
    local_1e8._0_4_ = fVar236;
    local_1e8._8_4_ = fVar241;
    local_1e8._12_4_ = 0;
    local_208._4_4_ = fVar337;
    local_208._0_4_ = fVar335;
    local_208._8_4_ = fVar230;
    local_208._12_4_ = 0;
    local_228 = fVar235 + (fVar309 - fVar269) * 3.0 * fVar261;
    fStack_224 = fVar236 + fVar198;
    fStack_220 = fVar240 + fVar308;
    fStack_21c = fVar241 + fVar324;
    local_1f8 = fVar333 + (fVar233 - fVar242) * 3.0 * fVar261;
    fStack_1f4 = fVar335 + fVar329;
    fStack_1f0 = fVar337 + fVar270;
    fStack_1ec = fVar230 + fVar285;
    local_1c8._0_4_ = fVar236 - fVar198;
    local_1c8._4_4_ = fVar240 - fVar308;
    local_1c8._8_4_ = fVar241 - fVar324;
    local_1c8._12_4_ = 0;
    local_218._0_4_ = fVar335 - fVar329;
    local_218._4_4_ = fVar337 - fVar270;
    local_218._8_4_ = fVar230 - fVar285;
    local_218._12_4_ = 0;
    fVar198 = (fVar236 - fStack_374) + (fVar235 - local_378);
    fVar308 = (fVar240 - fStack_370) + (fVar236 - fStack_374);
    fVar324 = (fVar241 - fStack_36c) + (fVar240 - fStack_370);
    fVar329 = (fVar241 - fStack_36c) + 0.0;
    local_1d8._8_4_ = fStack_22c;
    local_1d8._12_4_ = 0;
    fVar269 = (fVar335 - fStack_234) + (fVar333 - local_238);
    fVar270 = (fVar337 - fStack_230) + (fVar335 - fStack_234);
    fVar285 = (fVar230 - fStack_22c) + (fVar337 - fStack_230);
    fVar286 = (fVar230 - fStack_22c) + 0.0;
    auVar210._0_8_ =
         CONCAT44(fStack_234 * fVar308 - fStack_374 * fVar270,
                  local_238 * fVar198 - local_378 * fVar269);
    auVar210._8_4_ = fStack_230 * fVar324 - fStack_370 * fVar285;
    auVar210._12_4_ = fStack_22c * fVar329 - fStack_36c * fVar286;
    auVar159._0_4_ = fVar197 * fVar198 - local_358 * fVar269;
    auVar159._4_4_ = fVar302 * fVar308 - fStack_354 * fVar270;
    auVar159._8_4_ = fVar322 * fVar324 - fStack_350 * fVar285;
    auVar159._12_4_ = fVar326 * fVar329 - fStack_34c * fVar286;
    auVar188._0_8_ =
         CONCAT44((float)local_528._4_4_ * fVar308 - fVar270 * local_368._4_4_,
                  (float)local_528._0_4_ * fVar198 - fVar269 * local_368._0_4_);
    auVar188._8_4_ = fStack_520 * fVar324 - fVar285 * local_368._8_4_;
    auVar188._12_4_ = fVar329 * 0.0 - fVar286 * 0.0;
    auVar319._0_4_ = fVar198 * fStack_234 - fVar269 * fStack_374;
    auVar319._4_4_ = fVar308 * fStack_230 - fVar270 * fStack_370;
    auVar319._8_4_ = fVar324 * fStack_22c - fVar285 * fStack_36c;
    auVar319._12_4_ = fVar329 * 0.0 - fVar286 * 0.0;
    auVar253._0_8_ =
         CONCAT44(fVar335 * fVar308 - fVar236 * fVar270,fVar333 * fVar198 - fVar235 * fVar269);
    auVar253._8_4_ = fVar337 * fVar324 - fVar240 * fVar285;
    auVar253._12_4_ = fVar230 * fVar329 - fVar241 * fVar286;
    auVar331._0_4_ = local_1f8 * fVar198 - local_228 * fVar269;
    auVar331._4_4_ = fStack_1f4 * fVar308 - fStack_224 * fVar270;
    auVar331._8_4_ = fStack_1f0 * fVar324 - fStack_220 * fVar285;
    auVar331._12_4_ = fStack_1ec * fVar329 - fStack_21c * fVar286;
    auVar221._0_8_ =
         CONCAT44(local_218._4_4_ * fVar308 - fVar270 * local_1c8._4_4_,
                  local_218._0_4_ * fVar198 - fVar269 * local_1c8._0_4_);
    auVar221._8_4_ = local_218._8_4_ * fVar324 - fVar285 * local_1c8._8_4_;
    auVar221._12_4_ = fVar329 * 0.0 - fVar286 * 0.0;
    auVar90._0_4_ = fVar198 * fVar335 - fVar269 * fVar236;
    auVar90._4_4_ = fVar308 * fVar337 - fVar270 * fVar240;
    auVar90._8_4_ = fVar324 * fVar230 - fVar285 * fVar241;
    auVar90._12_4_ = fVar329 * 0.0 - fVar286 * 0.0;
    auVar123._8_4_ = auVar210._8_4_;
    auVar123._0_8_ = auVar210._0_8_;
    auVar123._12_4_ = auVar210._12_4_;
    auVar71 = minps(auVar123,auVar159);
    auVar252 = maxps(auVar210,auVar159);
    auVar160._8_4_ = auVar188._8_4_;
    auVar160._0_8_ = auVar188._0_8_;
    auVar160._12_4_ = auVar188._12_4_;
    auVar137 = minps(auVar160,auVar319);
    auVar71 = minps(auVar71,auVar137);
    auVar137 = maxps(auVar188,auVar319);
    auVar139 = maxps(auVar252,auVar137);
    auVar161._8_4_ = auVar253._8_4_;
    auVar161._0_8_ = auVar253._0_8_;
    auVar161._12_4_ = auVar253._12_4_;
    auVar137 = minps(auVar161,auVar331);
    auVar254 = maxps(auVar253,auVar331);
    auVar189._8_4_ = auVar221._8_4_;
    auVar189._0_8_ = auVar221._0_8_;
    auVar189._12_4_ = auVar221._12_4_;
    auVar252 = minps(auVar189,auVar90);
    auVar137 = minps(auVar137,auVar252);
    auVar71 = minps(auVar71,auVar137);
    auVar137 = maxps(auVar221,auVar90);
    auVar137 = maxps(auVar254,auVar137);
    auVar137 = maxps(auVar139,auVar137);
    auVar211._0_4_ =
         -(uint)(local_258 <= auVar137._0_4_ && auVar71._0_4_ <= local_248) & local_268._0_4_;
    auVar211._4_4_ =
         -(uint)(fStack_254 <= auVar137._4_4_ && auVar71._4_4_ <= fStack_244) & local_268._4_4_;
    auVar211._8_4_ =
         -(uint)(fStack_250 <= auVar137._8_4_ && auVar71._8_4_ <= fStack_240) & local_268._8_4_;
    auVar211._12_4_ =
         -(uint)(fStack_24c <= auVar137._12_4_ && auVar71._12_4_ <= fStack_23c) & local_268._12_4_;
    iVar53 = movmskps((int)uVar56,auVar211);
    if (iVar53 != 0) {
      fVar198 = (fVar236 - fVar235) + (fStack_374 - local_378);
      fVar308 = (fVar240 - fVar236) + (fStack_370 - fStack_374);
      fVar324 = (fVar241 - fVar240) + (fStack_36c - fStack_370);
      fVar329 = (0.0 - fVar241) + (0.0 - fStack_36c);
      fVar269 = (fVar335 - fVar333) + (fStack_234 - local_238);
      fVar270 = (fVar337 - fVar335) + (fStack_230 - fStack_234);
      fVar285 = (fVar230 - fVar337) + (fStack_22c - fStack_230);
      fVar286 = (0.0 - fVar230) + (0.0 - fStack_22c);
      auVar339._0_8_ =
           CONCAT44(fStack_234 * fVar308 - fStack_374 * fVar270,
                    local_238 * fVar198 - local_378 * fVar269);
      auVar339._8_4_ = fStack_230 * fVar324 - fStack_370 * fVar285;
      auVar339._12_4_ = fStack_22c * fVar329 - fStack_36c * fVar286;
      auVar162._0_4_ = fVar197 * fVar198 - local_358 * fVar269;
      auVar162._4_4_ = fVar302 * fVar308 - fStack_354 * fVar270;
      auVar162._8_4_ = fVar322 * fVar324 - fStack_350 * fVar285;
      auVar162._12_4_ = fVar326 * fVar329 - fStack_34c * fVar286;
      auVar222._0_8_ =
           CONCAT44((float)local_528._4_4_ * fVar308 - local_368._4_4_ * fVar270,
                    (float)local_528._0_4_ * fVar198 - local_368._0_4_ * fVar269);
      auVar222._8_4_ = fStack_520 * fVar324 - local_368._8_4_ * fVar285;
      auVar222._12_4_ = fVar329 * 0.0 - fVar286 * 0.0;
      auVar190._0_4_ = fStack_234 * fVar198 - fStack_374 * fVar269;
      auVar190._4_4_ = fStack_230 * fVar308 - fStack_370 * fVar270;
      auVar190._8_4_ = fStack_22c * fVar324 - fStack_36c * fVar285;
      auVar190._12_4_ = fVar329 * 0.0 - fVar286 * 0.0;
      auVar144._0_8_ =
           CONCAT44(fVar335 * fVar308 - fVar236 * fVar270,fVar333 * fVar198 - fVar235 * fVar269);
      auVar144._8_4_ = fVar337 * fVar324 - fVar240 * fVar285;
      auVar144._12_4_ = fVar230 * fVar329 - fVar241 * fVar286;
      auVar275._0_4_ = local_1f8 * fVar198 - local_228 * fVar269;
      auVar275._4_4_ = fStack_1f4 * fVar308 - fStack_224 * fVar270;
      auVar275._8_4_ = fStack_1f0 * fVar324 - fStack_220 * fVar285;
      auVar275._12_4_ = fStack_1ec * fVar329 - fStack_21c * fVar286;
      auVar320._0_8_ =
           CONCAT44(local_218._4_4_ * fVar308 - local_1c8._4_4_ * fVar270,
                    local_218._0_4_ * fVar198 - local_1c8._0_4_ * fVar269);
      auVar320._8_4_ = local_218._8_4_ * fVar324 - local_1c8._8_4_ * fVar285;
      auVar320._12_4_ = fVar329 * 0.0 - fVar286 * 0.0;
      auVar91._0_4_ = fVar198 * fVar335 - fVar269 * fVar236;
      auVar91._4_4_ = fVar308 * fVar337 - fVar270 * fVar240;
      auVar91._8_4_ = fVar324 * fVar230 - fVar285 * fVar241;
      auVar91._12_4_ = fVar329 * 0.0 - fVar286 * 0.0;
      auVar124._8_4_ = auVar339._8_4_;
      auVar124._0_8_ = auVar339._0_8_;
      auVar124._12_4_ = auVar339._12_4_;
      auVar71 = minps(auVar124,auVar162);
      auVar252 = maxps(auVar339,auVar162);
      auVar163._8_4_ = auVar222._8_4_;
      auVar163._0_8_ = auVar222._0_8_;
      auVar163._12_4_ = auVar222._12_4_;
      auVar137 = minps(auVar163,auVar190);
      auVar71 = minps(auVar71,auVar137);
      auVar137 = maxps(auVar222,auVar190);
      auVar254 = maxps(auVar252,auVar137);
      auVar164._8_4_ = auVar144._8_4_;
      auVar164._0_8_ = auVar144._0_8_;
      auVar164._12_4_ = auVar144._12_4_;
      auVar252 = minps(auVar164,auVar275);
      auVar137 = maxps(auVar144,auVar275);
      auVar191._8_4_ = auVar320._8_4_;
      auVar191._0_8_ = auVar320._0_8_;
      auVar191._12_4_ = auVar320._12_4_;
      auVar139 = minps(auVar191,auVar91);
      auVar252 = minps(auVar252,auVar139);
      auVar71 = minps(auVar71,auVar252);
      auVar252 = maxps(auVar320,auVar91);
      auVar137 = maxps(auVar137,auVar252);
      auVar137 = maxps(auVar254,auVar137);
      auVar340._0_4_ =
           -(uint)(local_258 <= auVar137._0_4_ && auVar71._0_4_ <= local_248) & auVar211._0_4_;
      auVar340._4_4_ =
           -(uint)(fStack_254 <= auVar137._4_4_ && auVar71._4_4_ <= fStack_244) & auVar211._4_4_;
      auVar340._8_4_ =
           -(uint)(fStack_250 <= auVar137._8_4_ && auVar71._8_4_ <= fStack_240) & auVar211._8_4_;
      auVar340._12_4_ =
           -(uint)(fStack_24c <= auVar137._12_4_ && auVar71._12_4_ <= fStack_23c) & auVar211._12_4_;
      uVar65 = movmskps(iVar53,auVar340);
      if (uVar65 != 0) {
        uVar56 = (ulong)uVar67;
        afStack_328[uVar56] = (float)(uVar65 & 0xff);
        *(ulong *)(afStack_108 + uVar56 * 2) = CONCAT44(fVar171,fVar133);
        *(ulong *)(afStack_58 + uVar56 * 2) = CONCAT44(fVar107,fVar106);
        uVar67 = uVar67 + 1;
      }
    }
LAB_00b36a73:
    auVar137 = _local_518;
    auVar71 = _local_528;
    if (uVar67 == 0) {
      if (bVar60 != false) {
        return bVar60;
      }
      fVar147 = *(float *)(ray + k * 4 + 0x80);
      auVar132._4_4_ = -(uint)(fStack_284 <= fVar147);
      auVar132._0_4_ = -(uint)(local_288 <= fVar147);
      auVar132._8_4_ = -(uint)(fStack_280 <= fVar147);
      auVar132._12_4_ = -(uint)(fStack_27c <= fVar147);
      uVar65 = movmskps((int)k,auVar132);
      uVar64 = uVar64 & uVar64 + 0xf & uVar65;
      if (uVar64 == 0) {
        return false;
      }
      goto LAB_00b35611;
    }
    uVar65 = uVar67 - 1;
    uVar56 = (ulong)uVar65;
    fVar133 = afStack_328[uVar56];
    fVar106 = afStack_58[uVar56 * 2];
    fVar107 = afStack_58[uVar56 * 2 + 1];
    uVar55 = 0;
    if (fVar133 != 0.0) {
      for (; ((uint)fVar133 >> uVar55 & 1) == 0; uVar55 = uVar55 + 1) {
      }
    }
    fVar133 = (float)((int)fVar133 - 1U & (uint)fVar133);
    afStack_328[uVar56] = fVar133;
    if (fVar133 == 0.0) {
      uVar67 = uVar65;
    }
    fVar171 = (float)(uVar55 + 1) * 0.33333334;
    fVar197 = afStack_108[uVar56 * 2];
    fVar198 = afStack_108[uVar56 * 2 + 1];
    fVar133 = fVar197 * (1.0 - (float)uVar55 * 0.33333334) + fVar198 * (float)uVar55 * 0.33333334;
    fVar171 = fVar197 * (1.0 - fVar171) + fVar198 * fVar171;
    fVar302 = fVar197 * 0.0 + fVar198 * 0.0;
    fVar198 = fVar197 * 0.0 + fVar198 * 0.0;
    fVar197 = fVar171 - fVar133;
    if (fVar197 < 0.16666667) {
      fVar333 = 1.0 - fVar106;
      fVar337 = 1.0 - fVar106;
      fVar236 = 1.0 - fVar107;
      fVar240 = 1.0 - fVar107;
      fVar329 = fVar203 * fVar333 + fVar219 * fVar106;
      fVar335 = fVar204 * fVar337 + fVar229 * fVar106;
      fVar230 = fVar203 * fVar236 + fVar219 * fVar107;
      fVar235 = fVar204 * fVar240 + fVar229 * fVar107;
      fVar308 = fVar199 * fVar333 + fVar218 * fVar106;
      fVar322 = fVar202 * fVar337 + fVar260 * fVar106;
      fVar324 = fVar199 * fVar236 + fVar218 * fVar107;
      fVar326 = fVar202 * fVar240 + fVar260 * fVar107;
      fVar232 = fVar281 * fVar333 + fVar263 * fVar106;
      fVar237 = fVar284 * fVar337 + fVar328 * fVar106;
      fVar239 = fVar281 * fVar236 + fVar263 * fVar107;
      fVar243 = fVar284 * fVar240 + fVar328 * fVar107;
      fVar286 = (fVar333 * fVar234 + fVar106 * fVar147) - fVar232;
      fVar309 = (fVar337 * fVar268 + fVar106 * fVar70) - fVar237;
      fVar220 = (fVar236 * fVar234 + fVar107 * fVar147) - fVar239;
      fVar231 = (fVar240 * fVar268 + fVar107 * fVar70) - fVar243;
      fVar333 = fVar133 * (fVar232 - fVar308) + fVar308;
      fVar337 = fVar133 * (fVar237 - fVar322) + fVar322;
      fVar236 = fVar133 * (fVar239 - fVar324) + fVar324;
      fVar240 = fVar133 * (fVar243 - fVar326) + fVar326;
      fVar233 = (fVar232 - fVar308) * fVar171 + fVar308;
      fVar238 = (fVar237 - fVar322) * fVar171 + fVar322;
      fVar242 = (fVar239 - fVar324) * fVar171 + fVar324;
      fVar244 = (fVar243 - fVar326) * fVar171 + fVar326;
      fVar241 = fVar133 * (fVar308 - fVar329) + fVar329;
      fVar269 = fVar133 * (fVar322 - fVar335) + fVar335;
      fVar270 = fVar133 * (fVar324 - fVar230) + fVar230;
      fVar285 = fVar133 * (fVar326 - fVar235) + fVar235;
      fVar241 = (fVar333 - fVar241) * fVar133 + fVar241;
      fVar269 = (fVar337 - fVar269) * fVar133 + fVar269;
      fVar270 = (fVar236 - fVar270) * fVar133 + fVar270;
      fVar285 = (fVar240 - fVar285) * fVar133 + fVar285;
      fVar333 = (((fVar133 * fVar286 + fVar232) - fVar333) * fVar133 + fVar333) - fVar241;
      fVar337 = (((fVar133 * fVar309 + fVar237) - fVar337) * fVar133 + fVar337) - fVar269;
      fVar236 = (((fVar133 * fVar220 + fVar239) - fVar236) * fVar133 + fVar236) - fVar270;
      fVar240 = (((fVar133 * fVar231 + fVar243) - fVar240) * fVar133 + fVar240) - fVar285;
      fVar241 = fVar133 * fVar333 + fVar241;
      fVar269 = fVar133 * fVar337 + fVar269;
      fVar270 = fVar133 * fVar236 + fVar270;
      fVar285 = fVar133 * fVar240 + fVar285;
      fVar246 = (float)DAT_01f7ff50;
      fVar247 = DAT_01f7ff50._4_4_;
      fVar261 = DAT_01f7ff50._8_4_;
      fVar262 = DAT_01f7ff50._12_4_;
      fVar329 = (fVar308 - fVar329) * fVar171 + fVar329;
      fVar335 = (fVar322 - fVar335) * fVar171 + fVar335;
      fVar230 = (fVar324 - fVar230) * fVar171 + fVar230;
      fVar235 = (fVar326 - fVar235) * fVar171 + fVar235;
      fVar329 = (fVar233 - fVar329) * fVar171 + fVar329;
      fVar335 = (fVar238 - fVar335) * fVar171 + fVar335;
      fVar230 = (fVar242 - fVar230) * fVar171 + fVar230;
      fVar235 = (fVar244 - fVar235) * fVar171 + fVar235;
      fVar322 = (((fVar286 * fVar171 + fVar232) - fVar233) * fVar171 + fVar233) - fVar329;
      fVar324 = (((fVar309 * fVar171 + fVar237) - fVar238) * fVar171 + fVar238) - fVar335;
      fVar326 = (((fVar220 * fVar171 + fVar239) - fVar242) * fVar171 + fVar242) - fVar230;
      fVar238 = (((fVar231 * fVar171 + fVar243) - fVar244) * fVar171 + fVar244) - fVar235;
      fVar329 = fVar171 * fVar322 + fVar329;
      fVar335 = fVar171 * fVar324 + fVar335;
      fVar230 = fVar171 * fVar326 + fVar230;
      fVar235 = fVar171 * fVar238 + fVar235;
      fVar308 = fVar197 * 0.33333334;
      fVar286 = fVar333 * fVar246 * fVar308 + fVar241;
      fVar309 = fVar337 * fVar247 * fVar308 + fVar269;
      fVar220 = fVar236 * fVar261 * fVar308 + fVar270;
      fVar231 = fVar240 * fVar262 * fVar308 + fVar285;
      fVar232 = fVar329 - fVar308 * fVar322 * fVar246;
      fVar233 = fVar335 - fVar308 * fVar324 * fVar247;
      fVar237 = fVar230 - fVar308 * fVar326 * fVar261;
      fVar238 = fVar235 - fVar308 * fVar238 * fVar262;
      auVar24._4_8_ = DAT_01f7ff50._8_8_;
      auVar24._0_4_ = fVar335;
      auVar223._0_8_ = auVar24._0_8_ << 0x20;
      auVar223._8_4_ = fVar230;
      auVar223._12_4_ = fVar235;
      fVar333 = (fVar230 - fVar329) + (fVar270 - fVar241);
      fVar337 = (fVar235 - fVar335) + (fVar285 - fVar269);
      auVar255._0_4_ = fVar233 * fVar337;
      auVar255._4_4_ = fVar233 * fVar337;
      auVar255._8_4_ = fVar238 * fVar337;
      auVar255._12_4_ = fVar238 * fVar337;
      fVar308 = fVar241 * fVar333 + fVar269 * fVar337;
      fVar322 = fVar270 * fVar333 + fVar285 * fVar337;
      fVar236 = fVar286 * fVar333 + fVar309 * fVar337;
      fVar240 = fVar220 * fVar333 + fVar231 * fVar337;
      fVar239 = fVar232 * fVar333 + auVar255._0_4_;
      auVar212._0_8_ = CONCAT44(fVar233 * fVar333 + auVar255._4_4_,fVar239);
      auVar212._8_4_ = fVar237 * fVar333 + auVar255._8_4_;
      auVar212._12_4_ = fVar238 * fVar333 + auVar255._12_4_;
      fVar326 = fVar333 * fVar329 + fVar337 * fVar335;
      fVar242 = fVar333 * fVar230 + fVar337 * fVar235;
      auVar25._4_8_ = auVar255._8_8_;
      auVar25._0_4_ = fVar309 * fVar333 + fVar309 * fVar337;
      auVar256._0_8_ = auVar25._0_8_ << 0x20;
      auVar256._8_4_ = fVar240;
      auVar256._12_4_ = fVar231 * fVar333 + fVar231 * fVar337;
      fVar324 = fVar236;
      if (fVar236 <= fVar308) {
        fVar324 = fVar308;
        fVar308 = fVar236;
      }
      auVar257._8_8_ = auVar256._8_8_;
      auVar257._0_8_ = auVar257._8_8_;
      auVar92._8_4_ = auVar212._8_4_;
      auVar92._0_8_ = auVar212._0_8_;
      auVar92._12_4_ = auVar212._12_4_;
      if (fVar326 <= fVar239) {
        auVar92._0_4_ = fVar326;
      }
      if (auVar92._0_4_ <= fVar308) {
        fVar308 = auVar92._0_4_;
      }
      auVar26._4_8_ = auVar92._8_8_;
      auVar26._0_4_ = fVar333 * fVar335 + fVar337 * fVar335;
      auVar93._0_8_ = auVar26._0_8_ << 0x20;
      auVar93._8_4_ = fVar242;
      auVar93._12_4_ = fVar333 * fVar235 + fVar337 * fVar235;
      if (fVar326 <= fVar239) {
        fVar326 = fVar239;
      }
      auVar94._8_8_ = auVar93._8_8_;
      auVar94._0_8_ = auVar94._8_8_;
      if (fVar326 <= fVar324) {
        fVar326 = fVar324;
      }
      if (fVar240 <= fVar322) {
        auVar257._0_4_ = fVar322;
        fVar322 = fVar240;
      }
      auVar125._8_4_ = auVar212._8_4_;
      auVar125._0_8_ = auVar212._8_8_;
      auVar125._12_4_ = auVar212._12_4_;
      if (fVar242 <= auVar212._8_4_) {
        auVar125._0_4_ = fVar242;
      }
      if (auVar125._0_4_ <= fVar322) {
        fVar322 = auVar125._0_4_;
      }
      if (fVar242 <= auVar212._8_4_) {
        auVar94._0_4_ = auVar212._8_4_;
      }
      if (auVar94._0_4_ <= auVar257._0_4_) {
        auVar94._0_4_ = auVar257._0_4_;
      }
      fVar324 = auVar94._0_4_;
      if ((0.0001 <= fVar308) || (fVar324 <= -0.0001)) break;
      goto LAB_00b36dd6;
    }
  } while( true );
  if ((fVar322 < 0.0001 && -0.0001 < fVar326) ||
     ((fVar308 < 0.0001 && -0.0001 < fVar326 || (fVar322 < 0.0001 && -0.0001 < fVar324)))) {
LAB_00b36dd6:
    local_528 = (undefined1  [8])auVar223._8_8_;
    local_518._4_4_ = fVar235;
    local_518._0_4_ = fVar230;
    auVar252 = _local_518;
    fVar337 = (float)(~-(uint)(fVar308 < 0.0) & 0x3f800000 | -(uint)(fVar308 < 0.0) & 0xbf800000);
    fVar236 = (float)(~-(uint)(fVar326 < 0.0) & 0x3f800000 | -(uint)(fVar326 < 0.0) & 0xbf800000);
    fVar333 = 0.0;
    if ((fVar337 == fVar236) && (!NAN(fVar337) && !NAN(fVar236))) {
      fVar333 = INFINITY;
    }
    fVar240 = 0.0;
    if ((fVar337 == fVar236) && (!NAN(fVar337) && !NAN(fVar236))) {
      fVar240 = -INFINITY;
    }
    fVar239 = (float)(~-(uint)(fVar322 < 0.0) & 0x3f800000 | -(uint)(fVar322 < 0.0) & 0xbf800000);
    if ((fVar337 != fVar239) || (fVar242 = fVar240, NAN(fVar337) || NAN(fVar239))) {
      if ((fVar322 != fVar308) || (NAN(fVar322) || NAN(fVar308))) {
        fVar322 = -fVar308 / (fVar322 - fVar308);
        fVar322 = (1.0 - fVar322) * 0.0 + fVar322;
        fVar242 = fVar322;
      }
      else {
        fVar322 = 0.0;
        if ((fVar308 != 0.0) || (fVar242 = 1.0, NAN(fVar308))) {
          fVar322 = INFINITY;
          fVar242 = -INFINITY;
        }
      }
      if (fVar322 <= fVar333) {
        fVar333 = fVar322;
      }
      if (fVar242 <= fVar240) {
        fVar242 = fVar240;
      }
    }
    fVar308 = *(float *)(&DAT_01f80eb4 + (ulong)(fVar324 < 0.0) * 4);
    if ((fVar236 != fVar308) || (fVar322 = fVar242, NAN(fVar236) || NAN(fVar308))) {
      if ((fVar324 != fVar326) || (NAN(fVar324) || NAN(fVar326))) {
        fVar337 = -fVar326 / (fVar324 - fVar326);
        fVar337 = (1.0 - fVar337) * 0.0 + fVar337;
        fVar322 = fVar337;
      }
      else {
        fVar337 = 0.0;
        if ((fVar326 != 0.0) || (fVar322 = 1.0, NAN(fVar326))) {
          fVar337 = INFINITY;
          fVar322 = -INFINITY;
        }
      }
      if (fVar337 <= fVar333) {
        fVar333 = fVar337;
      }
      if (fVar322 <= fVar242) {
        fVar322 = fVar242;
      }
    }
    if ((fVar239 != fVar308) || (NAN(fVar239) || NAN(fVar308))) {
      fVar333 = (float)(~-(uint)(fVar333 < 1.0) & 0x3f800000 |
                       (uint)fVar333 & -(uint)(fVar333 < 1.0));
      fVar322 = (float)(~-(uint)(fVar322 < 1.0) & (uint)fVar322 |
                       -(uint)(fVar322 < 1.0) & 0x3f800000);
    }
    fVar333 = (float)(~-(uint)(fVar333 < 0.0) & (uint)fVar333);
    fVar308 = (float)(~-(uint)(fVar322 < 1.0) & 0x3f800000 | (uint)fVar322 & -(uint)(fVar322 < 1.0))
    ;
    _local_518 = auVar252;
    if (fVar333 <= fVar308) {
      fVar333 = fVar333 + -0.1;
      fVar308 = fVar308 + 0.1;
      uVar68 = -(uint)(fVar308 < 1.0);
      fVar333 = (float)(~-(uint)(fVar333 < 0.0) & (uint)fVar333);
      fVar308 = (float)(~uVar68 & 0x3f800000 | (uint)fVar308 & uVar68);
      fVar239 = 1.0 - fVar333;
      fVar242 = 1.0 - fVar333;
      fVar243 = 1.0 - fVar308;
      fVar244 = 1.0 - fVar308;
      fStack_520 = auVar71._8_4_;
      fStack_51c = auVar71._12_4_;
      fVar322 = fVar241 * fVar239 + fVar270 * fVar333;
      fVar326 = fVar269 * fVar242 + fVar285 * fVar333;
      fVar337 = fVar241 * fVar243 + fVar270 * fVar308;
      fVar236 = fVar269 * fVar244 + fVar285 * fVar308;
      fVar240 = fVar286 * fVar239 + fVar220 * fVar333;
      fVar241 = fVar309 * fVar242 + fVar231 * fVar333;
      fVar269 = fVar286 * fVar243 + fVar220 * fVar308;
      fVar270 = fVar309 * fVar244 + fVar231 * fVar308;
      fVar286 = fVar232 * fVar239 + fVar237 * fVar333;
      fVar309 = fVar233 * fVar242 + fVar238 * fVar333;
      fVar220 = fVar232 * fVar243 + fVar237 * fVar308;
      fVar231 = fVar233 * fVar244 + fVar238 * fVar308;
      fVar232 = fVar239 * fVar329 + fVar230 * fVar333;
      fVar233 = fVar242 * fVar335 + fVar235 * fVar333;
      fVar329 = fVar243 * fVar329 + fStack_520 * fVar308;
      fVar335 = fVar244 * fVar335 + fStack_51c * fVar308;
      fVar285 = fVar106 * (1.0 - fVar308);
      fVar106 = fVar106 * (1.0 - fVar333) + fVar107 * fVar333;
      fVar107 = fVar285 + fVar107 * fVar308;
      fVar285 = 1.0 / fVar197;
      auVar126._0_4_ = fVar329 - fVar232;
      auVar126._4_4_ = fVar335 - fVar233;
      auVar126._8_4_ = fVar329 - fVar329;
      auVar126._12_4_ = fVar335 - fVar335;
      auVar154._0_8_ = CONCAT44(fVar231 - fVar309,fVar220 - fVar286);
      auVar154._8_4_ = fVar220 - fVar220;
      auVar154._12_4_ = fVar231 - fVar231;
      auVar192._0_4_ = fVar269 - fVar240;
      auVar192._4_4_ = fVar270 - fVar241;
      auVar192._8_4_ = fVar269 - fVar269;
      auVar192._12_4_ = fVar270 - fVar270;
      auVar258._0_8_ = CONCAT44((fVar241 - fVar326) * fVar247,(fVar240 - fVar322) * fVar246);
      auVar258._8_4_ = (fVar269 - fVar337) * fVar261;
      auVar258._12_4_ = (fVar270 - fVar236) * fVar262;
      auVar165._0_8_ = CONCAT44((fVar309 - fVar241) * fVar247,(fVar286 - fVar240) * fVar246);
      auVar165._8_4_ = (fVar220 - fVar269) * fVar261;
      auVar165._12_4_ = (fVar231 - fVar270) * fVar262;
      auVar297._0_4_ = (fVar232 - fVar286) * fVar246;
      auVar297._4_4_ = (fVar233 - fVar309) * fVar247;
      auVar297._8_4_ = (fVar329 - fVar220) * fVar261;
      auVar297._12_4_ = (fVar335 - fVar231) * fVar262;
      auVar213._8_4_ = auVar165._8_4_;
      auVar213._0_8_ = auVar165._0_8_;
      auVar213._12_4_ = auVar165._12_4_;
      auVar139 = minps(auVar213,auVar297);
      auVar71 = maxps(auVar165,auVar297);
      auVar276._8_4_ = auVar258._8_4_;
      auVar276._0_8_ = auVar258._0_8_;
      auVar276._12_4_ = auVar258._12_4_;
      auVar277 = minps(auVar276,auVar139);
      auVar254 = maxps(auVar258,auVar71);
      auVar27._4_8_ = auVar71._8_8_;
      auVar27._0_4_ = auVar277._4_4_;
      auVar166._0_8_ = auVar27._0_8_ << 0x20;
      auVar166._8_4_ = auVar277._8_4_;
      auVar166._12_4_ = auVar277._12_4_;
      auVar167._8_8_ = auVar277._8_8_;
      auVar167._0_8_ = auVar166._8_8_;
      auVar28._4_8_ = auVar139._8_8_;
      auVar28._0_4_ = auVar254._4_4_;
      auVar214._0_8_ = auVar28._0_8_ << 0x20;
      auVar214._8_4_ = auVar254._8_4_;
      auVar214._12_4_ = auVar254._12_4_;
      auVar215._8_8_ = auVar254._8_8_;
      auVar215._0_8_ = auVar214._8_8_;
      auVar139 = minps(auVar277,auVar167);
      auVar71 = maxps(auVar254,auVar215);
      fVar244 = auVar139._0_4_ * fVar285;
      fVar264 = auVar139._4_4_ * fVar285;
      fVar265 = auVar139._8_4_ * fVar285;
      fVar266 = auVar139._12_4_ * fVar285;
      fVar286 = fVar285 * auVar71._0_4_;
      fVar220 = fVar285 * auVar71._4_4_;
      fVar232 = fVar285 * auVar71._8_4_;
      fVar285 = fVar285 * auVar71._12_4_;
      fVar242 = 1.0 / (fVar107 - fVar106);
      auVar95._0_8_ = CONCAT44(fVar236 - fVar326,fVar337 - fVar322);
      auVar95._8_4_ = fVar337 - fVar337;
      auVar95._12_4_ = fVar236 - fVar236;
      auVar224._8_4_ = auVar95._8_4_;
      auVar224._0_8_ = auVar95._0_8_;
      auVar224._12_4_ = auVar95._12_4_;
      auVar254 = minps(auVar224,auVar192);
      auVar71 = maxps(auVar95,auVar192);
      auVar145._8_4_ = auVar154._8_4_;
      auVar145._0_8_ = auVar154._0_8_;
      auVar145._12_4_ = auVar154._12_4_;
      auVar139 = minps(auVar145,auVar126);
      auVar254 = minps(auVar254,auVar139);
      auVar139 = maxps(auVar154,auVar126);
      auVar71 = maxps(auVar71,auVar139);
      fVar238 = auVar254._0_4_ * fVar242;
      fVar239 = auVar254._4_4_ * fVar242;
      fVar243 = fVar242 * auVar71._0_4_;
      fVar242 = fVar242 * auVar71._4_4_;
      local_528._4_4_ = fVar106;
      local_528._0_4_ = fVar133;
      fStack_520 = fVar171;
      fStack_51c = fVar107;
      auVar216._4_4_ = fVar107;
      auVar216._0_4_ = fVar171;
      auVar216._8_4_ = fVar302;
      auVar216._12_4_ = fVar198;
      fVar240 = (fVar133 + fVar171) * 0.5;
      fVar241 = (fVar106 + fVar107) * 0.5;
      fVar269 = (fVar171 + fVar302) * 0.0;
      fVar270 = (fVar107 + fVar198) * 0.0;
      fVar308 = local_118 * fVar240 + fVar203;
      fVar322 = fStack_114 * fVar240 + fVar204;
      fVar326 = fStack_110 * fVar240 + fStack_3c0;
      fVar329 = fStack_10c * fVar240 + fStack_3bc;
      fVar333 = local_128 * fVar240 + fVar199;
      fVar335 = fStack_124 * fVar240 + fVar202;
      fVar337 = fStack_120 * fVar240 + fVar218;
      fVar236 = fStack_11c * fVar240 + fVar260;
      fVar308 = (fVar333 - fVar308) * fVar240 + fVar308;
      fVar322 = (fVar335 - fVar322) * fVar240 + fVar322;
      fVar326 = (fVar337 - fVar326) * fVar240 + fVar326;
      fVar329 = (fVar236 - fVar329) * fVar240 + fVar329;
      fVar333 = (((local_138 * fVar240 + (float)local_338) - fVar333) * fVar240 + fVar333) - fVar308
      ;
      fVar335 = (((fStack_134 * fVar240 + local_338._4_4_) - fVar335) * fVar240 + fVar335) - fVar322
      ;
      fVar337 = (((fStack_130 * fVar240 + fStack_330) - fVar337) * fVar240 + fVar337) - fVar326;
      fVar236 = (((fStack_12c * fVar240 + fStack_32c) - fVar236) * fVar240 + fVar236) - fVar329;
      fVar308 = fVar240 * fVar333 + fVar308;
      fVar322 = fVar240 * fVar335 + fVar322;
      fVar333 = fVar333 * fVar246;
      fVar335 = fVar335 * fVar247;
      fVar326 = (fVar240 * fVar337 + fVar326) - fVar308;
      fVar329 = (fVar240 * fVar236 + fVar329) - fVar322;
      fVar333 = (fVar337 * fVar261 - fVar333) * fVar241 + fVar333;
      fVar335 = (fVar236 * fVar262 - fVar335) * fVar241 + fVar335;
      auVar155._0_8_ = CONCAT44(fVar333,fVar326) ^ 0x80000000;
      auVar155._8_4_ = fVar333;
      auVar155._12_4_ = fVar333;
      fVar246 = fVar133 - fVar240;
      fVar247 = fVar106 - fVar241;
      fVar261 = fVar171 - fVar269;
      fVar262 = fVar107 - fVar270;
      fVar267 = fVar171 - fVar240;
      fVar291 = fVar107 - fVar241;
      fVar302 = fVar302 - fVar269;
      fVar198 = fVar198 - fVar270;
      fVar308 = fVar326 * fVar241 + fVar308;
      fVar322 = fVar329 * fVar241 + fVar322;
      auVar168._0_8_ = CONCAT44(fVar335,fVar329) ^ 0x8000000000000000;
      auVar168._8_4_ = -fVar335;
      auVar168._12_4_ = -fVar335;
      auVar96._0_4_ = fVar329 * fVar333 - fVar335 * fVar326;
      auVar96._4_4_ = auVar96._0_4_;
      auVar96._8_4_ = auVar96._0_4_;
      auVar96._12_4_ = auVar96._0_4_;
      auVar139 = divps(auVar168,auVar96);
      auVar71 = divps(auVar155,auVar96);
      fVar269 = auVar139._0_4_;
      fVar270 = auVar139._4_4_;
      fVar337 = auVar71._0_4_;
      fVar236 = auVar71._4_4_;
      fVar240 = fVar240 - (fVar322 * fVar337 + fVar308 * fVar269);
      fVar333 = fVar241 - (fVar322 * fVar236 + fVar308 * fVar270);
      fVar335 = fVar241 - (fVar322 * auVar71._8_4_ + fVar308 * auVar139._8_4_);
      fVar241 = fVar241 - (fVar322 * auVar71._12_4_ + fVar308 * auVar139._12_4_);
      auVar127._0_8_ = CONCAT44(fVar270 * fVar238,fVar270 * fVar244);
      auVar127._8_4_ = fVar270 * fVar264;
      auVar127._12_4_ = fVar270 * fVar239;
      auVar97._0_4_ = fVar270 * fVar286;
      auVar97._4_4_ = fVar270 * fVar243;
      auVar97._8_4_ = fVar270 * fVar220;
      auVar97._12_4_ = fVar270 * fVar242;
      auVar342._8_4_ = auVar127._8_4_;
      auVar342._0_8_ = auVar127._0_8_;
      auVar342._12_4_ = auVar127._12_4_;
      auVar277 = minps(auVar342,auVar97);
      auVar71 = maxps(auVar97,auVar127);
      auVar193._0_8_ = CONCAT44(fVar236 * fVar239,fVar236 * fVar264);
      auVar193._8_4_ = fVar236 * fVar265;
      auVar193._12_4_ = fVar236 * fVar266;
      auVar128._0_4_ = fVar236 * fVar220;
      auVar128._4_4_ = fVar236 * fVar242;
      auVar128._8_4_ = fVar236 * fVar232;
      auVar128._12_4_ = fVar236 * fVar285;
      auVar278._8_4_ = auVar193._8_4_;
      auVar278._0_8_ = auVar193._0_8_;
      auVar278._12_4_ = auVar193._12_4_;
      auVar254 = minps(auVar278,auVar128);
      auVar139 = maxps(auVar128,auVar193);
      fVar308 = 0.0 - (auVar139._0_4_ + auVar71._0_4_);
      fVar322 = 1.0 - (auVar139._4_4_ + auVar71._4_4_);
      fVar326 = 0.0 - (auVar139._8_4_ + auVar71._8_4_);
      fVar329 = 0.0 - (auVar139._12_4_ + auVar71._12_4_);
      fVar309 = 0.0 - (auVar254._0_4_ + auVar277._0_4_);
      fVar231 = 1.0 - (auVar254._4_4_ + auVar277._4_4_);
      fVar233 = 0.0 - (auVar254._8_4_ + auVar277._8_4_);
      fVar237 = 0.0 - (auVar254._12_4_ + auVar277._12_4_);
      auVar129._0_8_ = CONCAT44(fVar247 * fVar322,fVar246 * fVar308);
      auVar129._8_4_ = fVar261 * fVar326;
      auVar129._12_4_ = fVar262 * fVar329;
      auVar298._0_8_ = CONCAT44(fVar238 * fVar269,fVar244 * fVar269);
      auVar298._8_4_ = fVar264 * fVar269;
      auVar298._12_4_ = fVar239 * fVar269;
      auVar194._0_4_ = fVar269 * fVar286;
      auVar194._4_4_ = fVar269 * fVar243;
      auVar194._8_4_ = fVar269 * fVar220;
      auVar194._12_4_ = fVar269 * fVar242;
      auVar279._8_4_ = auVar298._8_4_;
      auVar279._0_8_ = auVar298._0_8_;
      auVar279._12_4_ = auVar298._12_4_;
      auVar139 = minps(auVar279,auVar194);
      auVar71 = maxps(auVar194,auVar298);
      auVar225._0_8_ = CONCAT44(fVar239 * fVar337,fVar264 * fVar337);
      auVar225._8_4_ = fVar265 * fVar337;
      auVar225._12_4_ = fVar266 * fVar337;
      auVar299._0_4_ = fVar337 * fVar220;
      auVar299._4_4_ = fVar337 * fVar242;
      auVar299._8_4_ = fVar337 * fVar232;
      auVar299._12_4_ = fVar337 * fVar285;
      auVar341._8_4_ = auVar225._8_4_;
      auVar341._0_8_ = auVar225._0_8_;
      auVar341._12_4_ = auVar225._12_4_;
      auVar277 = minps(auVar341,auVar299);
      auVar280._0_4_ = fVar246 * fVar309;
      auVar280._4_4_ = fVar247 * fVar231;
      auVar280._8_4_ = fVar261 * fVar233;
      auVar280._12_4_ = fVar262 * fVar237;
      auVar98._0_8_ = CONCAT44(fVar322 * fVar291,fVar308 * fVar267);
      auVar98._8_4_ = fVar326 * fVar302;
      auVar98._12_4_ = fVar329 * fVar198;
      auVar201._0_4_ = fVar309 * fVar267;
      auVar201._4_4_ = fVar231 * fVar291;
      auVar201._8_4_ = fVar233 * fVar302;
      auVar201._12_4_ = fVar237 * fVar198;
      auVar254 = maxps(auVar299,auVar225);
      fVar308 = 1.0 - (auVar254._0_4_ + auVar71._0_4_);
      fVar322 = 0.0 - (auVar254._4_4_ + auVar71._4_4_);
      fVar326 = 0.0 - (auVar254._8_4_ + auVar71._8_4_);
      fVar329 = 0.0 - (auVar254._12_4_ + auVar71._12_4_);
      fVar285 = 1.0 - (auVar277._0_4_ + auVar139._0_4_);
      fVar286 = 0.0 - (auVar277._4_4_ + auVar139._4_4_);
      fVar309 = 0.0 - (auVar277._8_4_ + auVar139._8_4_);
      fVar220 = 0.0 - (auVar277._12_4_ + auVar139._12_4_);
      auVar226._0_8_ = CONCAT44(fVar247 * fVar322,fVar246 * fVar308);
      auVar226._8_4_ = fVar261 * fVar326;
      auVar226._12_4_ = fVar262 * fVar329;
      auVar321._0_4_ = fVar246 * fVar285;
      auVar321._4_4_ = fVar247 * fVar286;
      auVar321._8_4_ = fVar261 * fVar309;
      auVar321._12_4_ = fVar262 * fVar220;
      auVar195._0_8_ = CONCAT44(fVar322 * fVar291,fVar308 * fVar267);
      auVar195._8_4_ = fVar326 * fVar302;
      auVar195._12_4_ = fVar329 * fVar198;
      auVar259._0_4_ = fVar285 * fVar267;
      auVar259._4_4_ = fVar286 * fVar291;
      auVar259._8_4_ = fVar309 * fVar302;
      auVar259._12_4_ = fVar220 * fVar198;
      auVar300._8_4_ = auVar226._8_4_;
      auVar300._0_8_ = auVar226._0_8_;
      auVar300._12_4_ = auVar226._12_4_;
      auVar71 = minps(auVar300,auVar321);
      auVar332._8_4_ = auVar195._8_4_;
      auVar332._0_8_ = auVar195._0_8_;
      auVar332._12_4_ = auVar195._12_4_;
      auVar139 = minps(auVar332,auVar259);
      auVar301 = minps(auVar71,auVar139);
      auVar139 = maxps(auVar321,auVar226);
      auVar71 = maxps(auVar259,auVar195);
      auVar254 = maxps(auVar71,auVar139);
      auVar227._8_4_ = auVar129._8_4_;
      auVar227._0_8_ = auVar129._0_8_;
      auVar227._12_4_ = auVar129._12_4_;
      auVar139 = minps(auVar227,auVar280);
      auVar196._8_4_ = auVar98._8_4_;
      auVar196._0_8_ = auVar98._0_8_;
      auVar196._12_4_ = auVar98._12_4_;
      auVar71 = minps(auVar196,auVar201);
      auVar139 = minps(auVar139,auVar71);
      auVar277 = maxps(auVar280,auVar129);
      auVar71 = maxps(auVar201,auVar98);
      auVar71 = maxps(auVar71,auVar277);
      auVar228._0_4_ = auVar301._4_4_ + auVar301._0_4_ + fVar240;
      auVar228._4_4_ = auVar139._4_4_ + auVar139._0_4_ + fVar333;
      auVar228._8_4_ = auVar301._8_4_ + auVar301._4_4_ + fVar335;
      auVar228._12_4_ = auVar301._12_4_ + auVar139._4_4_ + fVar241;
      fVar198 = auVar254._4_4_ + auVar254._0_4_ + fVar240;
      fVar302 = auVar71._4_4_ + auVar71._0_4_ + fVar333;
      auVar99._4_4_ = fVar302;
      auVar99._0_4_ = fVar198;
      auVar139 = maxps(_local_528,auVar228);
      auVar99._8_4_ = auVar254._8_4_ + auVar254._4_4_ + fVar335;
      auVar99._12_4_ = auVar254._12_4_ + auVar71._4_4_ + fVar241;
      auVar71 = minps(auVar99,auVar216);
      iVar53 = -(uint)(auVar71._0_4_ < auVar139._0_4_);
      iVar66 = -(uint)(auVar71._4_4_ < auVar139._4_4_);
      auVar101._4_4_ = iVar66;
      auVar101._0_4_ = iVar53;
      auVar101._8_4_ = iVar66;
      auVar101._12_4_ = iVar66;
      auVar100._8_8_ = auVar101._8_8_;
      auVar100._4_4_ = iVar53;
      auVar100._0_4_ = iVar53;
      iVar53 = movmskpd((uint)(fVar324 < 0.0),auVar100);
      if (iVar53 == 0) {
        bVar52 = 0;
        if ((fVar133 < auVar228._0_4_) && (fVar198 < fVar171)) {
          bVar52 = -(fVar302 < fVar107) & fVar106 < auVar228._4_4_;
        }
        bVar52 = (3 < uVar67 || fVar197 < 0.001) | bVar52;
        uVar56 = (ulong)CONCAT31((int3)(uVar65 >> 8),bVar52);
        if (bVar52 != 1) goto LAB_00b36401;
        lVar57 = 200;
        do {
          fVar106 = 1.0 - fVar240;
          fVar197 = fVar240 * fVar240 * fVar240;
          fVar171 = fVar240 * fVar240 * 3.0 * fVar106;
          fVar107 = fVar106 * fVar106 * fVar106;
          fVar198 = fVar240 * 3.0 * fVar106 * fVar106;
          fStack_510 = auVar137._8_4_;
          fStack_50c = auVar137._12_4_;
          fVar133 = fVar107 * fVar203 +
                    fVar198 * fVar199 + fVar171 * (float)local_338 + fVar197 * fVar230;
          fVar106 = fVar107 * fVar204 +
                    fVar198 * fVar202 + fVar171 * local_338._4_4_ + fVar197 * fVar235;
          fVar133 = ((fVar107 * fStack_3c0 +
                     fVar198 * fVar218 + fVar171 * fStack_330 + fVar197 * fStack_510) - fVar133) *
                    fVar333 + fVar133;
          fVar106 = ((fVar107 * fStack_3bc +
                     fVar198 * fVar260 + fVar171 * fStack_32c + fVar197 * fStack_50c) - fVar106) *
                    fVar333 + fVar106;
          fVar240 = fVar240 - (fVar106 * fVar337 + fVar133 * fVar269);
          fVar333 = fVar333 - (fVar106 * fVar236 + fVar133 * fVar270);
          fVar133 = (float)((uint)fVar133 & (uint)DAT_01f7b6c0);
          fVar106 = (float)((uint)fVar106 & DAT_01f7b6c0._4_4_);
          if (fVar106 <= fVar133) {
            fVar106 = fVar133;
          }
          if (fVar106 < fVar219) {
            if ((((0.0 <= fVar240) && (fVar240 <= 1.0)) && (0.0 <= fVar333)) && (fVar333 <= 1.0)) {
              fVar106 = pre->ray_space[k].vx.field_0.m128[2];
              fVar107 = pre->ray_space[k].vy.field_0.m128[2];
              fVar133 = pre->ray_space[k].vz.field_0.m128[2];
              fVar322 = 1.0 - fVar333;
              fVar308 = 1.0 - fVar240;
              fVar171 = fVar308 * fVar308 * fVar308;
              fVar197 = fVar240 * 3.0 * fVar308 * fVar308;
              fVar302 = fVar240 * fVar240 * fVar240;
              fVar198 = fVar240 * fVar240 * 3.0 * fVar308;
              fVar106 = ((fStack_140 * fVar133 + fStack_144 * fVar107 + local_148 * fVar106) *
                         fVar322 +
                        (fStack_180 * fVar133 + fStack_184 * fVar107 + local_188 * fVar106) *
                        fVar333) * fVar171 +
                        ((fStack_150 * fVar133 + fStack_154 * fVar107 + local_158 * fVar106) *
                         fVar322 +
                        (fStack_190 * fVar133 + fStack_194 * fVar107 + local_198 * fVar106) *
                        fVar333) * fVar197 +
                        ((fStack_160 * fVar133 + fStack_164 * fVar107 + local_168 * fVar106) *
                         fVar322 +
                        (fStack_1a0 * fVar133 + fStack_1a4 * fVar107 + local_1a8 * fVar106) *
                        fVar333) * fVar198 +
                        (fVar322 * (fStack_170 * fVar133 +
                                   fStack_174 * fVar107 + local_178 * fVar106) +
                        (fVar133 * fStack_1b0 + fVar107 * fStack_1b4 + fVar106 * local_1b8) *
                        fVar333) * fVar302;
              if ((fVar105 <= fVar106) &&
                 (fVar107 = *(float *)(ray + k * 4 + 0x80), fVar106 <= fVar107)) {
                fVar326 = 1.0 - fVar333;
                fVar329 = 1.0 - fVar333;
                fVar335 = 1.0 - fVar333;
                fVar133 = fVar287 * fVar326 + fVar289 * fVar333;
                fVar322 = fVar288 * fVar329 + fVar305 * fVar333;
                fVar324 = fVar283 * fVar335 + fVar311 * fVar333;
                fVar337 = fVar290 * fVar326 + fVar146 * fVar333;
                fVar235 = fVar303 * fVar329 + fVar157 * fVar333;
                fVar241 = fVar306 * fVar335 + fVar170 * fVar333;
                fVar230 = fVar337 - fVar133;
                fVar236 = fVar235 - fVar322;
                fVar269 = fVar241 - fVar324;
                fVar133 = (((fVar133 - (fVar217 * fVar326 + fVar135 * fVar333)) * fVar308 +
                           fVar240 * fVar230) * fVar308 +
                          (fVar230 * fVar308 +
                          ((fVar326 * fVar134 + local_278 * fVar333) - fVar337) * fVar240) * fVar240
                          ) * 3.0;
                fVar322 = (((fVar322 - (fVar245 * fVar329 + fVar156 * fVar333)) * fVar308 +
                           fVar240 * fVar236) * fVar308 +
                          (fVar236 * fVar308 +
                          ((fVar329 * fVar148 + fStack_274 * fVar333) - fVar235) * fVar240) *
                          fVar240) * 3.0;
                fVar308 = (((fVar324 - (fVar282 * fVar335 + fVar169 * fVar333)) * fVar308 +
                           fVar240 * fVar269) * fVar308 +
                          (fVar269 * fVar308 +
                          ((fVar335 * fVar158 + fStack_270 * fVar333) - fVar241) * fVar240) *
                          fVar240) * 3.0;
                pGVar15 = (context->scene->geometries).items[local_380].ptr;
                if ((pGVar15->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                  bVar63 = false;
                }
                else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                        (bVar63 = true, pGVar15->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                  fVar324 = fVar171 * local_298 +
                            fVar197 * local_2a8 + fVar198 * local_2b8 + fVar302 * local_2c8;
                  fVar326 = fVar171 * fStack_294 +
                            fVar197 * fStack_2a4 + fVar198 * fStack_2b4 + fVar302 * fStack_2c4;
                  fVar171 = fVar171 * fStack_290 +
                            fVar197 * fStack_2a0 + fVar198 * fStack_2b0 + fVar302 * fStack_2c0;
                  local_c8 = fVar326 * fVar133 - fVar322 * fVar324;
                  local_e8 = fVar171 * fVar322 - fVar308 * fVar326;
                  local_d8 = fVar324 * fVar308 - fVar133 * fVar171;
                  fStack_e4 = local_e8;
                  fStack_e0 = local_e8;
                  fStack_dc = local_e8;
                  fStack_d4 = local_d8;
                  fStack_d0 = local_d8;
                  fStack_cc = local_d8;
                  fStack_c4 = local_c8;
                  fStack_c0 = local_c8;
                  fStack_bc = local_c8;
                  local_b8 = fVar240;
                  fStack_b4 = fVar240;
                  fStack_b0 = fVar240;
                  fStack_ac = fVar240;
                  local_a8 = fVar333;
                  fStack_a4 = fVar333;
                  fStack_a0 = fVar333;
                  fStack_9c = fVar333;
                  local_98 = CONCAT44(uStack_2e4,local_2e8);
                  uStack_90 = CONCAT44(uStack_2dc,uStack_2e0);
                  local_88 = CONCAT44(uStack_2d4,local_2d8);
                  uStack_80 = CONCAT44(uStack_2cc,uStack_2d0);
                  local_78 = context->user->instID[0];
                  uStack_74 = local_78;
                  uStack_70 = local_78;
                  uStack_6c = local_78;
                  local_68 = context->user->instPrimID[0];
                  uStack_64 = local_68;
                  uStack_60 = local_68;
                  uStack_5c = local_68;
                  *(float *)(ray + k * 4 + 0x80) = fVar106;
                  local_3a8 = *local_390;
                  local_318.valid = (int *)local_3a8;
                  local_318.geometryUserPtr = pGVar15->userPtr;
                  local_318.context = context->user;
                  local_318.ray = (RTCRayN *)ray;
                  local_318.hit = (RTCHitN *)&local_e8;
                  local_318.N = 4;
                  p_Var58 = pGVar15->occlusionFilterN;
                  if (p_Var58 != (RTCFilterFunctionN)0x0) {
                    p_Var58 = (RTCFilterFunctionN)(*p_Var58)(&local_318);
                  }
                  auVar130._0_4_ = -(uint)(local_3a8._0_4_ == 0);
                  auVar130._4_4_ = -(uint)(local_3a8._4_4_ == 0);
                  auVar130._8_4_ = -(uint)(local_3a8._8_4_ == 0);
                  auVar130._12_4_ = -(uint)(local_3a8._12_4_ == 0);
                  uVar65 = movmskps((int)p_Var58,auVar130);
                  pRVar59 = (RTCRayN *)(ulong)(uVar65 ^ 0xf);
                  if ((uVar65 ^ 0xf) == 0) {
                    auVar130 = auVar130 ^ _DAT_01f7ae20;
                  }
                  else {
                    p_Var58 = context->args->filter;
                    if ((p_Var58 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar15->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var58)(&local_318);
                    }
                    auVar102._0_4_ = -(uint)(local_3a8._0_4_ == 0);
                    auVar102._4_4_ = -(uint)(local_3a8._4_4_ == 0);
                    auVar102._8_4_ = -(uint)(local_3a8._8_4_ == 0);
                    auVar102._12_4_ = -(uint)(local_3a8._12_4_ == 0);
                    auVar130 = auVar102 ^ _DAT_01f7ae20;
                    *(undefined1 (*) [16])(local_318.ray + 0x80) =
                         ~auVar102 & _DAT_01f7aa00 |
                         *(undefined1 (*) [16])(local_318.ray + 0x80) & auVar102;
                    pRVar59 = local_318.ray;
                  }
                  auVar131._0_4_ = auVar130._0_4_ << 0x1f;
                  auVar131._4_4_ = auVar130._4_4_ << 0x1f;
                  auVar131._8_4_ = auVar130._8_4_ << 0x1f;
                  auVar131._12_4_ = auVar130._12_4_ << 0x1f;
                  iVar53 = movmskps((int)pRVar59,auVar131);
                  bVar63 = iVar53 != 0;
                  if (!bVar63) {
                    *(float *)(ray + k * 4 + 0x80) = fVar107;
                  }
                }
                bVar60 = (bool)(bVar60 | bVar63);
              }
            }
            break;
          }
          lVar57 = lVar57 + -1;
        } while (lVar57 != 0);
      }
    }
  }
  goto LAB_00b36a73;
}

Assistant:

static __forceinline bool occluded_hn(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          const Vec3fa ray_org(ray.org.x[k], ray.org.y[k], ray.org.z[k]);
          const TensorLinearCubicBezierSurface3fa curve = geom->getNormalOrientedHermiteCurve<typename Intersector::SourceCurve3ff, typename Intersector::SourceCurve3fa, TensorLinearCubicBezierSurface3fa>(context, ray_org, primID,ray.time()[k]);
          if (Intersector().intersect(pre,ray,k,context,geom,primID,curve,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }